

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O1

TestCaseGroup * vkt::pipeline::createSpecConstantTests(TestContext *testCtx)

{
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *this;
  VkShaderStageFlagBits VVar1;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *this_00;
  undefined8 uVar2;
  undefined1 auVar3 [8];
  ulong *puVar4;
  long lVar5;
  DataType specConstId;
  DataType DVar6;
  DataType DVar7;
  TestNode *pTVar8;
  SpecConstantTest *pSVar9;
  char *pcVar10;
  size_t sVar11;
  ostream *poVar12;
  long *plVar13;
  pointer __dest;
  pointer *__dest_00;
  int iVar14;
  CaseDefinition *__return_storage_ptr__;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  DataType type;
  uint uVar16;
  OffsetValue *o4;
  long lVar17;
  CaseDefinition defs [5];
  string globalDecl;
  string accumTypeStr;
  string mainCode_1;
  string caseName;
  string ssboDecl;
  ostringstream mainCode;
  StageDef stages [6];
  TestContext *local_1038;
  VkShaderStageFlagBits local_1030;
  SpecConstantTest *local_1028;
  TestNode *local_1020;
  long local_1018;
  undefined1 *local_1010;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1008;
  string *local_1000;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *local_ff8;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *local_ff0;
  TestNode **local_fe8;
  TestNode *local_fe0;
  string *local_fd8;
  pointer *local_fd0;
  undefined1 *local_fc8;
  undefined8 *local_fc0;
  string *local_fb8;
  pointer *local_fb0;
  undefined1 *local_fa8;
  undefined1 *local_fa0;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *local_f98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f88;
  pointer *local_f80;
  long *local_f78;
  long **local_f70;
  pointer *local_f68;
  undefined1 local_f60 [8];
  _Alloc_hider local_f58;
  pointer local_f50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f48;
  deUint32 local_f38;
  GenericValue local_f30;
  undefined1 local_f28 [64];
  _Alloc_hider local_ee8;
  pointer local_ee0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ed8;
  _Alloc_hider local_ec8;
  pointer local_ec0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_eb8;
  _Alloc_hider local_ea8;
  pointer local_ea0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e98;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  local_e88;
  FeatureFlags local_e70;
  undefined8 *local_e68;
  undefined8 local_e60;
  undefined2 local_e58;
  undefined1 uStack_e55;
  undefined1 uStack_e4e;
  undefined1 local_e4d;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  local_e48;
  undefined8 local_e30;
  pointer *local_e28;
  pointer local_e20;
  pointer local_e18 [2];
  undefined1 *local_e08;
  undefined8 local_e00;
  undefined1 local_df8 [16];
  pointer *local_de8;
  pointer local_de0;
  pointer local_dd8 [2];
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  local_dc8;
  undefined4 local_db0;
  long *local_da8;
  long local_da0;
  long local_d98 [2];
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  local_d88;
  undefined8 local_d70;
  pointer *local_d68;
  pointer local_d60;
  pointer local_d58;
  undefined1 local_d4b;
  undefined1 *local_d48;
  undefined8 local_d40;
  undefined1 local_d38 [16];
  pointer *local_d28;
  pointer local_d20;
  pointer local_d18 [2];
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  local_d08;
  undefined4 local_cf0;
  pointer *local_ce8;
  pointer local_ce0;
  pointer local_cd8 [2];
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  local_cc8;
  undefined8 local_cb0;
  ulong *local_ca8;
  ulong local_ca0;
  ulong local_c98;
  undefined1 local_c8a;
  undefined1 *local_c88;
  undefined8 local_c80;
  undefined1 local_c78 [16];
  pointer *local_c68;
  pointer local_c60;
  pointer local_c58 [2];
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  local_c48;
  undefined4 local_c30;
  ulong *local_c28;
  ulong local_c20;
  ulong local_c18 [2];
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  local_c08;
  undefined8 local_bf0;
  ulong *local_be8;
  pointer *local_be0;
  pointer *local_bd8;
  undefined1 local_bc9;
  undefined1 *local_bc8;
  undefined8 local_bc0;
  undefined1 local_bb8 [16];
  pointer **local_ba8;
  pointer *local_ba0;
  pointer *local_b98 [2];
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  local_b88;
  undefined4 local_b70;
  ulong *local_b68;
  ulong local_b60;
  ulong local_b58 [2];
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  local_b48;
  undefined8 local_b30;
  long *local_b28;
  long local_b20;
  long local_b18 [2];
  long *local_b08;
  long local_b00;
  long local_af8 [2];
  long *local_ae8;
  long local_ae0;
  long local_ad8 [2];
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  local_ac8;
  undefined4 local_ab0;
  undefined2 *local_aa8;
  undefined8 local_aa0;
  undefined2 local_a98;
  undefined1 local_a96;
  undefined1 local_a95;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  local_a88;
  undefined8 local_a70;
  undefined1 *local_a68 [2];
  undefined1 local_a58 [16];
  undefined1 *local_a48 [2];
  undefined1 local_a38 [16];
  undefined1 *local_a28 [2];
  undefined1 local_a18 [16];
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  local_a08;
  undefined4 local_9f0;
  pointer **local_9e0;
  pointer *local_9d8;
  pointer *local_9d0 [2];
  undefined1 local_9c0 [8];
  _Alloc_hider local_9b8;
  undefined1 local_9b0 [24];
  deUint32 local_998;
  GenericValue local_990;
  OffsetValue local_988;
  pointer local_978 [2];
  undefined1 local_968 [8];
  _Alloc_hider local_960;
  size_type local_958;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_950;
  deUint32 local_940;
  GenericValue local_938;
  undefined1 local_930 [8];
  _Alloc_hider local_928;
  undefined1 local_920 [24];
  deUint32 local_908;
  GenericValue local_900;
  OffsetValue local_8f8;
  pointer local_8e8 [2];
  undefined1 local_8d8 [8];
  _Alloc_hider local_8d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_8c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8c0;
  deUint32 local_8b0;
  GenericValue local_8a8;
  undefined1 local_8a0 [8];
  _Alloc_hider local_898;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_890;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_888;
  deUint32 local_878;
  GenericValue local_870;
  undefined1 local_868 [8];
  _Alloc_hider local_860;
  undefined1 local_858 [24];
  deUint32 local_840;
  GenericValue local_838;
  undefined1 local_830 [8];
  _Alloc_hider local_828;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_820;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_818;
  deUint32 local_808;
  GenericValue local_800;
  undefined1 local_7f8 [8];
  _Alloc_hider local_7f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_7e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7e0;
  deUint32 local_7d0;
  GenericValue local_7c8;
  undefined1 local_7c0 [8];
  _Alloc_hider local_7b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_7b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7a8;
  deUint32 local_798;
  GenericValue local_790;
  OffsetValue local_788;
  pointer local_778 [2];
  OffsetValue local_768;
  pointer local_758 [2];
  OffsetValue local_748;
  pointer local_738 [2];
  OffsetValue local_728;
  pointer local_718 [2];
  OffsetValue local_708;
  pointer local_6f8 [2];
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *local_6e8;
  TestNode *local_6e0;
  undefined1 local_6d8 [8];
  _Alloc_hider local_6d0;
  pointer local_6c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6c0;
  deUint32 local_6b0;
  GenericValue local_6a8;
  ulong *local_6a0;
  ulong local_698;
  ulong local_690 [2];
  ulong *local_680;
  ulong local_678;
  ulong local_670 [2];
  ulong *local_660;
  ulong local_658;
  ulong local_650 [2];
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *local_640;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *local_638;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *local_630;
  OffsetValue local_628;
  pointer **local_618;
  OffsetValue local_610;
  pointer *local_600 [2];
  OffsetValue local_5f0;
  ulong local_5e0 [2];
  ulong **local_5d0;
  ulong *local_5c8;
  OffsetValue local_5c0;
  undefined1 local_5b0 [8];
  _Alloc_hider local_5a8;
  char local_5a0 [8];
  undefined1 local_598 [16];
  deUint32 local_588;
  GenericValue local_580;
  VkDeviceSize local_578;
  _Alloc_hider local_570;
  size_type local_568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_560 [3];
  undefined1 auStack_530 [32];
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  vStack_510;
  FeatureFlags local_4f8;
  ulong *local_4f0;
  ulong *local_4e8;
  TestNode *local_4e0;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *local_4d8;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *local_4d0;
  pointer **local_4c8;
  string *local_4c0;
  undefined1 *local_4b8;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *local_4b0;
  pointer *local_4a8;
  string *local_4a0;
  undefined1 *local_498;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *local_490;
  pointer *local_488;
  string *local_480;
  undefined1 *local_478;
  OffsetValue local_470;
  deUint64 local_460 [2];
  OffsetValue local_450;
  OffsetValue local_440;
  value_type local_430;
  value_type local_420;
  value_type local_410;
  OffsetValue local_400;
  OffsetValue local_3f0;
  OffsetValue local_3e0;
  undefined1 *local_3d0;
  string *local_3c8;
  string *local_3c0;
  string *local_3b8;
  long local_3b0;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *local_3a8;
  long *local_3a0;
  string *local_398;
  long *local_390;
  string *local_388;
  long *local_380;
  string *local_378;
  ulong *local_370;
  OffsetValue local_368;
  OffsetValue local_358;
  OffsetValue local_348;
  undefined1 local_338 [8];
  _Alloc_hider local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  deUint32 local_310;
  GenericValue local_308;
  ios_base local_2c8 [264];
  undefined1 *local_1c0;
  OffsetValue local_1b8;
  OffsetValue local_1a8;
  OffsetValue local_198;
  OffsetValue local_188;
  OffsetValue local_178;
  OffsetValue local_168;
  OffsetValue local_158;
  OffsetValue local_148;
  OffsetValue local_138;
  OffsetValue local_128;
  OffsetValue local_118;
  OffsetValue local_108;
  OffsetValue local_f8;
  OffsetValue local_e8;
  OffsetValue local_d8;
  TestNode *local_c8;
  char *local_c0;
  VkShaderStageFlagBits local_b8 [2];
  TestNode *local_b0;
  char *local_a8;
  undefined4 local_a0;
  TestNode *local_98;
  char *local_90;
  undefined4 local_88;
  TestNode *local_80;
  char *local_78;
  undefined4 local_70;
  TestNode *local_68;
  char *local_60;
  undefined4 local_58;
  TestNode *local_50;
  char *local_48;
  undefined4 local_40;
  
  local_4e0 = (TestNode *)operator_new(0x70);
  local_1038 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_4e0,testCtx,"spec_constant","Specialization constants tests");
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar8,local_1038,"graphics","");
  local_c0 = "vertex";
  local_b8[0] = VK_SHADER_STAGE_VERTEX_BIT;
  local_a8 = "fragment";
  local_a0 = 0x10;
  local_90 = "tess_control";
  local_88 = 2;
  local_78 = "tess_eval";
  local_70 = 4;
  local_60 = "geometry";
  local_58 = 8;
  local_50 = local_4e0;
  local_48 = "compute";
  local_40 = 0x20;
  local_c8 = pTVar8;
  local_b0 = pTVar8;
  local_98 = pTVar8;
  local_80 = pTVar8;
  local_68 = pTVar8;
  tcu::TestNode::addChild(local_4e0,pTVar8);
  local_fa0 = local_f28 + 0x10;
  local_fa8 = local_f28;
  local_1000 = (string *)&local_ea8;
  local_1008 = &local_e98;
  local_ff0 = &local_e88;
  local_fc0 = (undefined8 *)&local_e58;
  local_1010 = auStack_530;
  local_ff8 = &vStack_510;
  local_f90 = &local_ed8;
  local_6e8 = &local_e48;
  local_fd8 = (string *)&local_e28;
  local_fd0 = local_e18;
  local_fc8 = local_df8;
  local_fb8 = (string *)&local_de8;
  local_fb0 = local_dd8;
  local_f98 = &local_dc8;
  local_f78 = local_d98;
  local_630 = &local_d88;
  local_f68 = &local_d58;
  local_478 = local_d38;
  local_480 = (string *)&local_d28;
  local_488 = local_d18;
  local_490 = &local_d08;
  local_f80 = local_cd8;
  local_638 = &local_cc8;
  local_4e8 = &local_c98;
  local_498 = local_c78;
  local_4a0 = (string *)&local_c68;
  local_4a8 = local_c58;
  local_4b0 = &local_c48;
  local_5c8 = local_c18;
  local_640 = &local_c08;
  local_4f0 = (ulong *)&local_bd8;
  local_4b8 = local_bb8;
  local_4c0 = (string *)&local_ba8;
  local_4c8 = local_b98;
  local_4d0 = &local_b88;
  local_3b8 = (string *)&local_d68;
  local_3c0 = (string *)&local_ca8;
  local_3c8 = (string *)&local_be8;
  local_f70 = &local_da8;
  local_618 = &local_ce8;
  local_5d0 = &local_c28;
  local_370 = local_b58;
  local_4d8 = &local_b48;
  local_378 = (string *)&local_b28;
  local_380 = local_b18;
  local_388 = (string *)&local_b08;
  local_390 = local_af8;
  local_398 = (string *)&local_ae8;
  local_3a0 = local_ad8;
  local_3a8 = &local_ac8;
  local_f88 = &local_eb8;
  local_3d0 = local_a58;
  local_1c0 = local_a38;
  local_3b0 = 0;
  do {
    local_6e0 = (TestNode *)operator_new(0x70);
    lVar5 = local_3b0;
    lVar17 = local_3b0 * 3;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_6e0,local_1038,*(char **)(local_b8 + local_3b0 * 6 + -2),"");
    VVar1 = local_b8[lVar5 * 6];
    local_fe8 = &local_c8 + lVar17;
    pTVar8 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,local_1038,"default_value","use default constant value");
    local_f28._0_8_ = local_f28 + 0x10;
    local_f28._8_8_ = 4;
    local_f28._16_5_ = 0x6c6f6f62;
    local_7c0 = (undefined1  [8])&local_7b0;
    local_5b0 = (undefined1  [8])0x32;
    local_7c0 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_7c0,(ulong)local_5b0);
    local_7b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5b0;
    *(undefined8 *)((long)local_7c0 + 0x20) = 0x73206c6f6f622074;
    *(undefined8 *)((long)local_7c0 + 0x28) = 0x757274203d203063;
    *(undefined8 *)((long)local_7c0 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_7c0 + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_7c0 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_7c0 + 4),"ut(c",4);
    *(undefined4 *)((long)local_7c0 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_7c0 + 0xc),"ant_",4);
    *(undefined2 *)((long)local_7c0 + 0x30) = 0x3b65;
    local_7b8._M_p = (pointer)local_5b0;
    *(char *)((long)local_7c0 + (long)local_5b0) = '\0';
    local_338._0_4_ = 1;
    local_330._M_p = (pointer)&local_320;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_330,local_7c0,(char *)((long)local_5b0 + (long)local_7c0));
    local_310 = 0;
    local_308.m_data = 0;
    local_8a0 = (undefined1  [8])&local_890;
    local_f60 = (undefined1  [8])&DAT_00000033;
    local_8a0 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_8a0,(ulong)local_f60);
    local_890 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f60;
    *(undefined8 *)((long)local_8a0 + 0x20) = 0x73206c6f6f622074;
    *(undefined8 *)((long)local_8a0 + 0x28) = 0x6c6166203d203163;
    *(undefined8 *)((long)local_8a0 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_8a0 + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_8a0 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_8a0 + 4),"ut(c",4);
    *(undefined4 *)((long)local_8a0 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_8a0 + 0xc),"ant_",4);
    builtin_strncpy((char *)((long)local_8a0 + 0x2f),"lse;",4);
    local_898._M_p = (pointer)local_f60;
    *(char *)((long)local_8a0 + (long)local_f60) = '\0';
    local_5b0._0_4_ = 2;
    local_5a8._M_p = local_598;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5a8,local_8a0,(char *)((long)local_f60 + (long)local_8a0));
    local_588 = 0;
    local_580.m_data = 0;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              ((vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
                *)(local_f28 + 0x20),(SpecConstant *)local_338,(SpecConstant *)local_5b0);
    local_f28._56_8_ = 8;
    local_ee8._M_p = (pointer)&local_ed8;
    local_f60 = (undefined1  [8])0x1a;
    local_ee8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)&local_ee8,(ulong)local_f60);
    local_ed8._M_allocated_capacity._0_5_ = local_f60._0_5_;
    local_ed8._M_allocated_capacity._5_3_ = local_f60._5_3_;
    builtin_strncpy(local_ee8._M_p,"    bool r0;\n    bool r1;\n",0x1a);
    local_ee0 = (pointer)local_f60;
    local_ee8._M_p[(long)local_f60] = '\0';
    local_ec8._M_p = (pointer)&local_eb8;
    local_ec0 = (pointer)0x0;
    local_eb8._M_allocated_capacity = local_eb8._M_allocated_capacity & 0xffffffffffffff00;
    local_ea8._M_p = (pointer)local_1008;
    local_f60 = (undefined1  [8])0x2a;
    local_ea8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)local_1000,(ulong)local_f60);
    local_e98._M_allocated_capacity = (size_type)local_f60;
    builtin_strncpy(local_ea8._M_p,"    sb_out.r0 = sc0;\n    sb_out.r1 = sc1;\n",0x2a);
    local_ea0 = (pointer)local_f60;
    local_ea8._M_p[(long)local_f60] = '\0';
    local_988.size = 4;
    local_988.offset = 0;
    local_988.value.m_data = 1;
    local_708.size = 4;
    local_708.offset = 4;
    local_708.value.m_data = 0;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_ff0,&local_988,&local_708);
    local_e70 = 0;
    local_e68 = local_fc0;
    *(undefined1 *)((long)local_fc0 + 2) = 0x74;
    *(undefined2 *)local_fc0 = 0x6e69;
    local_e60 = 3;
    uStack_e55 = 0;
    local_7f8 = (undefined1  [8])&local_7e8;
    local_9c0 = (undefined1  [8])0x2f;
    local_7f8 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_7f8,(ulong)local_9c0);
    local_7e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_9c0;
    builtin_strncpy((char *)((long)local_7f8 + 0x1f),"st int s",8);
    builtin_strncpy((char *)((long)local_7f8 + 0x27),"c0 = -3;",8);
    *(undefined8 *)((long)local_7f8 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_7f8 + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_7f8 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_7f8 + 4),"ut(c",4);
    *(undefined4 *)((long)local_7f8 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_7f8 + 0xc),"ant_",4);
    local_7f0._M_p = (pointer)local_9c0;
    *(char *)((long)local_7f8 + (long)local_9c0) = '\0';
    local_f60._0_4_ = 1;
    local_f58._M_p = (pointer)&local_f48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f58,local_7f8,(char *)((long)local_9c0 + (long)local_7f8));
    local_f38 = 0;
    local_f30.m_data = 0;
    local_8d8 = (undefined1  [8])&local_8c8;
    local_968 = (undefined1  [8])0x2f;
    local_8d8 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_8d8,(ulong)local_968);
    local_8c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_968;
    builtin_strncpy((char *)((long)local_8d8 + 0x1f),"st int s",8);
    builtin_strncpy((char *)((long)local_8d8 + 0x27),"c1 = 17;",8);
    *(undefined8 *)((long)local_8d8 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_8d8 + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_8d8 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_8d8 + 4),"ut(c",4);
    *(undefined4 *)((long)local_8d8 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_8d8 + 0xc),"ant_",4);
    local_8d0._M_p = (pointer)local_968;
    *(char *)((long)local_8d8 + (long)local_968) = '\0';
    local_9c0._0_4_ = 2;
    local_9b8._M_p = local_9b0 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_9b8,local_8d8,(char *)((long)local_968 + (long)local_8d8));
    local_998 = 0;
    local_990.m_data = 0;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_6e8,(SpecConstant *)local_f60,(SpecConstant *)local_9c0);
    local_e30 = 8;
    local_e28 = local_fd0;
    local_968 = (undefined1  [8])0x18;
    local_e28 = (pointer *)std::__cxx11::string::_M_create((ulong *)local_fd8,(ulong)local_968);
    local_e18[0] = (pointer)local_968;
    builtin_strncpy((char *)local_e28,"    int r0;\n    int r1;\n",0x18);
    local_e20 = (pointer)local_968;
    *(char *)((long)local_e28 + (long)local_968) = '\0';
    local_e08 = local_fc8;
    local_e00 = 0;
    local_df8[0] = 0;
    local_de8 = local_fb0;
    local_968 = (undefined1  [8])0x2a;
    local_de8 = (pointer *)std::__cxx11::string::_M_create((ulong *)local_fb8,(ulong)local_968);
    local_dd8[0] = (pointer)local_968;
    builtin_strncpy((char *)local_de8,"    sb_out.r0 = sc0;\n    sb_out.r1 = sc1;\n",0x2a);
    local_de0 = (pointer)local_968;
    *(char *)((long)local_de8 + (long)local_968) = '\0';
    local_728.size = 4;
    local_728.offset = 0;
    local_728.value.m_data = 0xfffffffd;
    local_748.size = 4;
    local_748.offset = 4;
    local_748.value.m_data = 0x11;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_f98,&local_728,&local_748);
    local_db0 = 0;
    local_da8 = local_f78;
    local_da0 = 4;
    local_d98[0] = CONCAT35(local_d98[0]._5_3_,0x746e6975);
    local_830 = (undefined1  [8])&local_820;
    local_930 = (undefined1  [8])0x31;
    local_830 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_830,(ulong)local_930);
    local_820 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_930;
    *(undefined8 *)((long)local_830 + 0x20) = 0x7320746e69752074;
    *(undefined8 *)((long)local_830 + 0x28) = 0x753234203d203063;
    *(undefined8 *)((long)local_830 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_830 + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_830 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_830 + 4),"ut(c",4);
    *(undefined4 *)((long)local_830 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_830 + 0xc),"ant_",4);
    *(char *)((long)local_830 + 0x30) = ';';
    local_828._M_p = (pointer)local_930;
    *(char *)((long)local_830 + (long)local_930) = '\0';
    local_968._0_4_ = 1;
    local_960._M_p = (pointer)&local_950;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_960,local_830,(char *)((long)local_930 + (long)local_830));
    local_940 = 0;
    local_938.m_data = 0;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_630,(SpecConstant *)local_968);
    local_d70 = 4;
    local_d68 = local_f68;
    builtin_strncpy((char *)((long)local_f68 + 5),"int r0;\n",8);
    *local_f68 = (pointer)0x746e697520202020;
    local_d60 = (pointer)0xd;
    local_d4b = 0;
    local_d48 = local_478;
    local_d40 = 0;
    local_d38[0] = 0;
    local_d28 = local_488;
    local_930 = (undefined1  [8])0x15;
    local_d28 = (pointer *)std::__cxx11::string::_M_create((ulong *)local_480,(ulong)local_930);
    local_d18[0] = (pointer)local_930;
    builtin_strncpy((char *)local_d28,"    sb_out.r0 = sc0;\n",0x15);
    local_d20 = (pointer)local_930;
    *(char *)((long)local_d28 + (long)local_930) = '\0';
    local_768.size = 4;
    local_768.offset = 0;
    local_768.value.m_data = 0x2a;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_490,&local_768);
    local_cf0 = 0;
    local_ce8 = local_f80;
    *(char *)((long)local_f80 + 4) = 't';
    *(undefined4 *)local_f80 = 0x616f6c66;
    local_ce0 = (pointer)0x5;
    local_cd8[0]._0_6_ = (uint6)(uint5)local_cd8[0];
    local_6d8 = (undefined1  [8])&local_6c8;
    local_868 = (undefined1  [8])0x32;
    local_6d8 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_6d8,(ulong)local_868);
    local_6c8 = (pointer)local_868;
    *(undefined8 *)((long)local_6d8 + 0x20) = 0x2074616f6c662074;
    *(undefined8 *)((long)local_6d8 + 0x28) = 0x2e37203d20306373;
    *(undefined8 *)((long)local_6d8 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_6d8 + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_6d8 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_6d8 + 4),"ut(c",4);
    *(undefined4 *)((long)local_6d8 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_6d8 + 0xc),"ant_",4);
    *(undefined2 *)((long)local_6d8 + 0x30) = 0x3b35;
    local_6d0._M_p = (pointer)local_868;
    *(char *)((long)local_6d8 + (long)local_868) = '\0';
    local_930._0_4_ = 1;
    local_928._M_p = local_920 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_928,local_6d8,(pointer)((long)local_868 + (long)local_6d8));
    local_908 = 0;
    local_900.m_data = 0;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_638,(SpecConstant *)local_930);
    puVar4 = local_4e8;
    local_cb0 = 4;
    local_ca8 = local_4e8;
    builtin_strncpy((char *)((long)local_4e8 + 6),"oat r0;\n",8);
    *puVar4 = 0x616f6c6620202020;
    local_ca0 = 0xe;
    local_c8a = 0;
    local_c88 = local_498;
    local_c80 = 0;
    local_c78[0] = 0;
    local_c68 = local_4a8;
    local_868 = (undefined1  [8])0x15;
    local_c68 = (pointer *)std::__cxx11::string::_M_create((ulong *)local_4a0,(ulong)local_868);
    local_c58[0] = (pointer)local_868;
    builtin_strncpy((char *)local_c68,"    sb_out.r0 = sc0;\n",0x15);
    local_c60 = (pointer)local_868;
    *(char *)((long)local_c68 + (long)local_868) = '\0';
    local_788.size = 4;
    local_788.offset = 0;
    local_788.value.m_data = 0x40f00000;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_4b0,&local_788);
    puVar4 = local_5c8;
    local_c30 = 0;
    local_c28 = local_5c8;
    pcVar10 = (char *)((long)local_5c8 + 4);
    pcVar10[0] = 'l';
    pcVar10[1] = 'e';
    *(undefined4 *)puVar4 = 0x62756f64;
    local_c20 = 6;
    local_c18[0]._0_7_ = (uint7)(uint6)local_c18[0];
    local_9e0 = local_9d0;
    local_8f8._0_8_ = (pointer *)0x36;
    local_9e0 = (pointer **)std::__cxx11::string::_M_create((ulong *)&local_9e0,(ulong)&local_8f8);
    local_9d0[0] = (pointer *)local_8f8._0_8_;
    local_9e0[4] = (pointer *)0x656c62756f642074;
    local_9e0[5] = (pointer *)0x32203d2030637320;
    local_9e0[2] = (pointer *)0x497b24203d206469;
    local_9e0[3] = (pointer *)0x736e6f6320297d44;
    *(undefined4 *)local_9e0 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_9e0 + 4),"ut(c",4);
    *(undefined4 *)(local_9e0 + 1) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_9e0 + 0xc),"ant_",4);
    builtin_strncpy((char *)((long)local_9e0 + 0x2e)," 2.75LF;",8);
    local_9d8 = (pointer *)local_8f8._0_8_;
    *(char *)((long)local_9e0 + local_8f8._0_8_) = '\0';
    local_868._0_4_ = 1;
    local_860._M_p = local_858 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_860,local_9e0,(char *)((long)local_9e0 + local_8f8._0_8_));
    local_840 = 0;
    local_838.m_data = 0;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_640,(SpecConstant *)local_868);
    puVar4 = local_4f0;
    local_bf0 = 8;
    local_be8 = local_4f0;
    builtin_strncpy((char *)((long)local_4f0 + 7),"ble r0;\n",8);
    *puVar4 = 0x62756f6420202020;
    local_be0 = (pointer *)0xf;
    local_bc9 = 0;
    local_bc8 = local_4b8;
    local_bc0 = 0;
    local_bb8[0] = 0;
    local_ba8 = local_4c8;
    local_8f8._0_8_ = (pointer *)0x15;
    local_ba8 = (pointer **)std::__cxx11::string::_M_create((ulong *)local_4c0,(ulong)&local_8f8);
    local_b98[0] = (pointer *)local_8f8._0_8_;
    builtin_strncpy((char *)local_ba8,"    sb_out.r0 = sc0;\n",0x15);
    local_ba0 = (pointer *)local_8f8._0_8_;
    *(char *)((long)local_ba8 + local_8f8._0_8_) = '\0';
    local_8f8.size = 8;
    local_8f8.offset = 0;
    local_8f8.value.m_data = 0x4006000000000000;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_4d0,&local_8f8);
    local_b70 = 4;
    if (local_860._M_p != local_858 + 8) {
      operator_delete(local_860._M_p,local_858._8_8_ + 1);
    }
    if (local_9e0 != local_9d0) {
      operator_delete(local_9e0,(long)local_9d0[0] + 1);
    }
    if (local_928._M_p != local_920 + 8) {
      operator_delete(local_928._M_p,local_920._8_8_ + 1);
    }
    if (local_6d8 != (undefined1  [8])&local_6c8) {
      operator_delete((void *)local_6d8,(ulong)(local_6c8 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_960._M_p != &local_950) {
      operator_delete(local_960._M_p,local_950._M_allocated_capacity + 1);
    }
    if (local_830 != (undefined1  [8])&local_820) {
      operator_delete((void *)local_830,(ulong)(local_820->_M_local_buf + 1));
    }
    if (local_9b8._M_p != local_9b0 + 8) {
      operator_delete(local_9b8._M_p,local_9b0._8_8_ + 1);
    }
    if (local_8d8 != (undefined1  [8])&local_8c8) {
      operator_delete((void *)local_8d8,(ulong)(local_8c8->_M_local_buf + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f58._M_p != &local_f48) {
      operator_delete(local_f58._M_p,local_f48._M_allocated_capacity + 1);
    }
    if (local_7f8 != (undefined1  [8])&local_7e8) {
      operator_delete((void *)local_7f8,(ulong)(local_7e8->_M_local_buf + 1));
    }
    if (local_5a8._M_p != local_598) {
      operator_delete(local_5a8._M_p,local_598._0_8_ + 1);
    }
    if (local_8a0 != (undefined1  [8])&local_890) {
      operator_delete((void *)local_8a0,(ulong)(local_890->_M_local_buf + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_p != &local_320) {
      operator_delete(local_330._M_p,local_320._M_allocated_capacity + 1);
    }
    if (local_7c0 != (undefined1  [8])&local_7b0) {
      operator_delete((void *)local_7c0,(ulong)(local_7b0->_M_local_buf + 1));
    }
    lVar17 = 0;
    do {
      pSVar9 = (SpecConstantTest *)operator_new(0x138);
      anon_unknown_0::SpecConstantTest::SpecConstantTest
                (pSVar9,local_1038,VVar1,(CaseDefinition *)(local_f28 + lVar17));
      tcu::TestNode::addChild(pTVar8,(TestNode *)pSVar9);
      lVar17 = lVar17 + 0xc0;
    } while (lVar17 != 0x3c0);
    lVar17 = 0x300;
    do {
      anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)(local_f28 + lVar17));
      lVar17 = lVar17 + -0xc0;
    } while (lVar17 != -0xc0);
    tcu::TestNode::addChild(local_6e0,pTVar8);
    VVar1 = *(VkShaderStageFlagBits *)(local_fe8 + 2);
    pTVar8 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,local_1038,"basic","specialize a constant");
    local_f28._0_8_ = local_f28 + 0x10;
    local_f28._8_8_ = 4;
    local_f28._16_5_ = 0x6c6f6f62;
    local_9e0 = local_9d0;
    local_5b0 = (undefined1  [8])0x32;
    local_9e0 = (pointer **)std::__cxx11::string::_M_create((ulong *)&local_9e0,(ulong)local_5b0);
    local_9d0[0] = (pointer *)local_5b0;
    local_9e0[4] = (pointer *)0x73206c6f6f622074;
    local_9e0[5] = (pointer *)0x757274203d203063;
    local_9e0[2] = (pointer *)0x497b24203d206469;
    local_9e0[3] = (pointer *)0x736e6f6320297d44;
    *(undefined4 *)local_9e0 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_9e0 + 4),"ut(c",4);
    *(undefined4 *)(local_9e0 + 1) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_9e0 + 0xc),"ant_",4);
    *(undefined2 *)(local_9e0 + 6) = 0x3b65;
    local_9d8 = (pointer *)local_5b0;
    *(char *)((long)local_9e0 + (long)local_5b0) = '\0';
    local_338._0_4_ = 1;
    local_330._M_p = (pointer)&local_320;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_330,local_9e0,(pointer)((long)local_5b0 + (long)local_9e0));
    local_310 = 4;
    local_308.m_data = 1;
    local_988._0_8_ = local_978;
    local_f60 = (undefined1  [8])0x33;
    local_988._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_988,(ulong)local_f60);
    local_978[0] = (pointer)local_f60;
    *(undefined8 *)(local_988._0_8_ + 0x20) = 0x73206c6f6f622074;
    *(undefined8 *)(local_988._0_8_ + 0x28) = 0x6c6166203d203163;
    *(undefined8 *)(local_988._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_988._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_988._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_988._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_988._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_988._0_8_ + 0xc),"ant_",4);
    builtin_strncpy((char *)(local_988._0_8_ + 0x2f),"lse;",4);
    local_988.value.m_data = (deUint64)local_f60;
    *(char *)(local_988._0_8_ + (long)local_f60) = '\0';
    local_5b0._0_4_ = 2;
    local_5a8._M_p = local_598;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5a8,local_988._0_8_,(char *)(local_988._0_8_ + (long)local_f60));
    local_588 = 4;
    local_580.m_data = 0;
    local_708._0_8_ = local_6f8;
    local_9c0 = (undefined1  [8])0x32;
    local_708._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_708,(ulong)local_9c0);
    local_6f8[0] = (pointer)local_9c0;
    *(undefined8 *)(local_708._0_8_ + 0x20) = 0x73206c6f6f622074;
    *(undefined8 *)(local_708._0_8_ + 0x28) = 0x757274203d203263;
    *(undefined8 *)(local_708._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_708._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_708._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_708._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_708._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_708._0_8_ + 0xc),"ant_",4);
    *(undefined2 *)(local_708._0_8_ + 0x30) = 0x3b65;
    local_708.value.m_data = (deUint64)local_9c0;
    *(char *)(local_708._0_8_ + (long)local_9c0) = '\0';
    local_f60._0_4_ = 3;
    local_f58._M_p = (pointer)&local_f48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f58,local_708._0_8_,(pointer)((long)local_9c0 + local_708._0_8_));
    local_f38 = 4;
    local_f30.m_data = 0;
    local_728._0_8_ = local_718;
    local_968 = (undefined1  [8])0x33;
    local_728._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_728,(ulong)local_968);
    local_718[0] = (pointer)local_968;
    *(undefined8 *)(local_728._0_8_ + 0x20) = 0x73206c6f6f622074;
    *(undefined8 *)(local_728._0_8_ + 0x28) = 0x6c6166203d203363;
    *(undefined8 *)(local_728._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_728._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_728._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_728._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_728._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_728._0_8_ + 0xc),"ant_",4);
    builtin_strncpy((char *)(local_728._0_8_ + 0x2f),"lse;",4);
    local_728.value.m_data = (deUint64)local_968;
    *(char *)(local_728._0_8_ + (long)local_968) = '\0';
    local_9c0._0_4_ = 4;
    local_9b8._M_p = local_9b0 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_9b8,local_728._0_8_,(char *)(local_728._0_8_ + (long)local_968));
    local_998 = 4;
    local_990.m_data = 1;
    this = (vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
            *)(local_f28 + 0x20);
    local_f28._32_8_ = (pointer)0x0;
    local_f28._40_8_ = (pointer)0x0;
    local_f28._48_8_ = (pointer)0x0;
    std::
    vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ::reserve(this,4);
    std::
    vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ::push_back(this,(value_type *)local_338);
    std::
    vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ::push_back(this,(value_type *)local_5b0);
    std::
    vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ::push_back(this,(value_type *)local_f60);
    std::
    vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ::push_back(this,(value_type *)local_9c0);
    local_f28._56_8_ = 0x10;
    local_ee8._M_p = (pointer)&local_ed8;
    local_968 = (undefined1  [8])0x34;
    local_ee8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)&local_ee8,(ulong)local_968);
    local_ed8._M_allocated_capacity._0_5_ = local_968._0_5_;
    local_ed8._M_allocated_capacity._5_3_ = local_968._5_3_;
    builtin_strncpy(local_ee8._M_p,"    bool r0;\n    bool r1;\n    bool r2;\n    bool r3;\n",0x34);
    local_ee0 = (pointer)local_968;
    local_ee8._M_p[(long)local_968] = '\0';
    local_ec8._M_p = (pointer)&local_eb8;
    local_ec0 = (pointer)0x0;
    local_eb8._M_allocated_capacity = local_eb8._M_allocated_capacity & 0xffffffffffffff00;
    local_ea8._M_p = (pointer)local_1008;
    local_968 = (undefined1  [8])0x54;
    local_ea8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)local_1000,(ulong)local_968);
    auVar3 = local_968;
    local_e98._M_allocated_capacity = (size_type)local_968;
    memcpy(local_ea8._M_p,
           "    sb_out.r0 = sc0;\n    sb_out.r1 = sc1;\n    sb_out.r2 = sc2;\n    sb_out.r3 = sc3;\n"
           ,0x54);
    local_ea0 = (pointer)auVar3;
    local_ea8._M_p[(long)auVar3] = '\0';
    local_470.size = 4;
    local_470.offset = 0;
    local_470.value.m_data = 1;
    local_3e0.size = 4;
    local_3e0.offset = 4;
    local_3e0.value.m_data = 0;
    local_3f0.size = 4;
    local_3f0.offset = 8;
    local_3f0.value.m_data = 0;
    local_400.size = 4;
    local_400.offset = 0xc;
    local_400.value.m_data = 1;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (local_ff0,&local_470,&local_3e0,&local_3f0,&local_400);
    local_e70 = 0;
    local_e68 = local_fc0;
    *(undefined1 *)((long)local_fc0 + 2) = 0x74;
    *(undefined2 *)local_fc0 = 0x6e69;
    local_e60 = 3;
    uStack_e55 = 0;
    local_748._0_8_ = local_738;
    local_930 = (undefined1  [8])0x2f;
    local_748._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_748,(ulong)local_930);
    local_738[0] = (pointer)local_930;
    builtin_strncpy((char *)(local_748._0_8_ + 0x1f),"st int s",8);
    builtin_strncpy((char *)(local_748._0_8_ + 0x27),"c0 = -3;",8);
    *(undefined8 *)(local_748._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_748._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_748._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_748._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_748._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_748._0_8_ + 0xc),"ant_",4);
    local_748.value.m_data = (deUint64)local_930;
    *(char *)(local_748._0_8_ + (long)local_930) = '\0';
    local_968._0_4_ = 1;
    local_960._M_p = (pointer)&local_950;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_960,local_748._0_8_,(pointer)((long)local_930 + local_748._0_8_));
    local_940 = 4;
    local_938.m_data = 0x21;
    local_768._0_8_ = local_758;
    local_868 = (undefined1  [8])0x2f;
    local_768._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_768,(ulong)local_868);
    local_758[0] = (pointer)local_868;
    builtin_strncpy((char *)(local_768._0_8_ + 0x1f),"st int s",8);
    builtin_strncpy((char *)(local_768._0_8_ + 0x27),"c1 = 91;",8);
    *(undefined8 *)(local_768._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_768._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_768._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_768._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_768._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_768._0_8_ + 0xc),"ant_",4);
    local_768.value.m_data = (deUint64)local_868;
    *(char *)(local_768._0_8_ + (long)local_868) = '\0';
    local_930._0_4_ = 2;
    local_928._M_p = local_920 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_928,local_768._0_8_,(pointer)((long)local_868 + local_768._0_8_));
    local_908 = 0;
    local_900.m_data = 0;
    local_788._0_8_ = local_778;
    local_7c0 = (undefined1  [8])0x2f;
    local_788._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_788,(ulong)local_7c0);
    local_778[0] = (pointer)local_7c0;
    builtin_strncpy((char *)(local_788._0_8_ + 0x1f),"st int s",8);
    builtin_strncpy((char *)(local_788._0_8_ + 0x27),"c2 = 17;",8);
    *(undefined8 *)(local_788._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_788._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_788._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_788._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_788._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_788._0_8_ + 0xc),"ant_",4);
    local_788.value.m_data = (deUint64)local_7c0;
    *(char *)(local_788._0_8_ + (long)local_7c0) = '\0';
    local_868._0_4_ = 3;
    local_860._M_p = local_858 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_860,local_788._0_8_,(char *)(local_788._0_8_ + (long)local_7c0));
    local_840 = 4;
    local_838.m_data = 0xfffffff1;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_6e8,(SpecConstant *)local_968,(SpecConstant *)local_930,
               (SpecConstant *)local_868);
    local_e30 = 0xc;
    local_e28 = local_fd0;
    local_7c0 = (undefined1  [8])0x24;
    local_e28 = (pointer *)std::__cxx11::string::_M_create((ulong *)local_fd8,(ulong)local_7c0);
    local_e18[0] = (pointer)local_7c0;
    builtin_strncpy((char *)local_e28,"    int r0;\n    int r1;\n    int r2;\n",0x24);
    local_e20 = (pointer)local_7c0;
    *(char *)((long)local_e28 + (long)local_7c0) = '\0';
    local_e08 = local_fc8;
    local_e00 = 0;
    local_df8[0] = 0;
    local_de8 = local_fb0;
    local_7c0 = (undefined1  [8])0x3f;
    local_de8 = (pointer *)std::__cxx11::string::_M_create((ulong *)local_fb8,(ulong)local_7c0);
    this_00 = local_f98;
    local_dd8[0] = (pointer)local_7c0;
    builtin_strncpy((char *)local_de8,
                    "    sb_out.r0 = sc0;\n    sb_out.r1 = sc1;\n    sb_out.r2 = sc2;\n",0x3f);
    local_de0 = (pointer)local_7c0;
    *(char *)((long)local_de8 + (long)local_7c0) = '\0';
    local_410.size = 4;
    local_410.offset = 0;
    local_410.value.m_data = 0x21;
    local_420.size = 4;
    local_420.offset = 4;
    local_420.value.m_data = 0x5b;
    local_430.size = 4;
    local_430.offset = 8;
    local_430.value.m_data = 0xfffffff1;
    (local_f98->
    super__Vector_base<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_f98->
    super__Vector_base<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_f98->
    super__Vector_base<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
    ::reserve(local_f98,3);
    std::
    vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
    ::push_back(this_00,&local_410);
    std::
    vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
    ::push_back(this_00,&local_420);
    std::
    vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
    ::push_back(this_00,&local_430);
    local_db0 = 0;
    local_da8 = local_f78;
    local_da0 = 4;
    local_d98[0] = CONCAT35(local_d98[0]._5_3_,0x746e6975);
    local_8f8._0_8_ = local_8e8;
    local_8a0 = (undefined1  [8])0x31;
    local_8f8._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_8f8,(ulong)local_8a0);
    local_8e8[0] = (pointer)local_8a0;
    *(undefined8 *)(local_8f8._0_8_ + 0x20) = 0x7320746e69752074;
    *(undefined8 *)(local_8f8._0_8_ + 0x28) = 0x753234203d203063;
    *(undefined8 *)(local_8f8._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_8f8._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_8f8._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_8f8._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_8f8._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_8f8._0_8_ + 0xc),"ant_",4);
    *(char *)(local_8f8._0_8_ + 0x30) = ';';
    local_8f8.value.m_data = (deUint64)local_8a0;
    *(char *)(local_8f8._0_8_ + (long)local_8a0) = '\0';
    local_7c0._0_4_ = 1;
    local_7b8._M_p = (pointer)&local_7a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7b8,local_8f8._0_8_,(char *)(local_8f8._0_8_ + (long)local_8a0));
    local_798 = 4;
    local_790.m_data = 0x61;
    local_660 = local_650;
    local_7f8 = (undefined1  [8])0x30;
    local_660 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_660,(ulong)local_7f8);
    local_650[0] = (ulong)local_7f8;
    local_660[4] = 0x7320746e69752074;
    local_660[5] = 0x3b7537203d203163;
    local_660[2] = 0x497b24203d206469;
    local_660[3] = 0x736e6f6320297d44;
    *(undefined4 *)local_660 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_660 + 4),"ut(c",4);
    *(undefined4 *)(local_660 + 1) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_660 + 0xc),"ant_",4);
    local_658 = (ulong)local_7f8;
    *(char *)((long)local_660 + (long)local_7f8) = '\0';
    local_8a0._0_4_ = 2;
    local_898._M_p = (pointer)&local_888;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_898,local_660,(char *)((long)local_660 + (long)local_7f8));
    local_878 = 0;
    local_870.m_data = 0;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_630,(SpecConstant *)local_7c0,(SpecConstant *)local_8a0);
    local_d70 = 8;
    local_d68 = local_f68;
    local_7f8 = (undefined1  [8])0x1a;
    local_d68 = (pointer *)std::__cxx11::string::_M_create((ulong *)local_3b8,(ulong)local_7f8);
    local_d58 = (pointer)local_7f8;
    builtin_strncpy((char *)local_d68,"    uint r0;\n    uint r1;\n",0x1a);
    local_d60 = (pointer)local_7f8;
    *(char *)((long)local_d68 + (long)local_7f8) = '\0';
    local_d48 = local_478;
    local_d40 = 0;
    local_d38[0] = 0;
    local_d28 = local_488;
    local_7f8 = (undefined1  [8])0x2a;
    local_d28 = (pointer *)std::__cxx11::string::_M_create((ulong *)local_480,(ulong)local_7f8);
    local_d18[0] = (pointer)local_7f8;
    builtin_strncpy((char *)local_d28,"    sb_out.r0 = sc0;\n    sb_out.r1 = sc1;\n",0x2a);
    local_d20 = (pointer)local_7f8;
    *(char *)((long)local_d28 + (long)local_7f8) = '\0';
    local_440.size = 4;
    local_440.offset = 0;
    local_440.value.m_data = 0x61;
    local_450.size = 4;
    local_450.offset = 4;
    local_450.value.m_data = 7;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_490,&local_440,&local_450);
    local_cf0 = 0;
    local_ce8 = local_f80;
    *(char *)((long)local_f80 + 4) = 't';
    *(undefined4 *)local_f80 = 0x616f6c66;
    local_ce0 = (pointer)0x5;
    local_cd8[0]._0_6_ = (uint6)(uint5)local_cd8[0];
    local_680 = local_670;
    local_8d8 = (undefined1  [8])0x32;
    local_680 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_680,(ulong)local_8d8);
    local_670[0] = (ulong)local_8d8;
    local_680[4] = 0x2074616f6c662074;
    local_680[5] = 0x2e37203d20306373;
    local_680[2] = 0x497b24203d206469;
    local_680[3] = 0x736e6f6320297d44;
    *(undefined4 *)local_680 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_680 + 4),"ut(c",4);
    *(undefined4 *)(local_680 + 1) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_680 + 0xc),"ant_",4);
    *(undefined2 *)(local_680 + 6) = 0x3b35;
    local_678 = (ulong)local_8d8;
    *(char *)((long)local_680 + (long)local_8d8) = '\0';
    local_7f8._0_4_ = 1;
    local_7f0._M_p = (pointer)&local_7e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7f0,local_680,(char *)((long)local_680 + (long)local_8d8));
    local_7d0 = 4;
    local_7c8.m_data = 0x417c0000;
    local_6a0 = local_690;
    local_830 = (undefined1  [8])0x34;
    local_6a0 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_6a0,(ulong)local_830);
    local_690[0] = (ulong)local_830;
    local_6a0[4] = 0x2074616f6c662074;
    local_6a0[5] = 0x2e31203d20316373;
    local_6a0[2] = 0x497b24203d206469;
    local_6a0[3] = 0x736e6f6320297d44;
    *(undefined4 *)local_6a0 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_6a0 + 4),"ut(c",4);
    *(undefined4 *)(local_6a0 + 1) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_6a0 + 0xc),"ant_",4);
    *(undefined4 *)(local_6a0 + 6) = 0x3b353231;
    local_698 = (ulong)local_830;
    *(char *)((long)local_6a0 + (long)local_830) = '\0';
    local_8d8._0_4_ = 2;
    local_8d0._M_p = (pointer)&local_8c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_8d0,local_6a0,(char *)((long)local_6a0 + (long)local_830));
    local_8b0 = 0;
    local_8a8.m_data = 0;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_638,(SpecConstant *)local_7f8,(SpecConstant *)local_8d8);
    local_cb0 = 8;
    local_ca8 = local_4e8;
    local_830 = (undefined1  [8])0x1c;
    local_ca8 = (ulong *)std::__cxx11::string::_M_create((ulong *)local_3c0,(ulong)local_830);
    local_c98 = (ulong)local_830;
    builtin_strncpy((char *)local_ca8,"    float r0;\n    float r1;\n",0x1c);
    local_ca0 = (ulong)local_830;
    *(char *)((long)local_ca8 + (long)local_830) = '\0';
    local_c88 = local_498;
    local_c80 = 0;
    local_c78[0] = 0;
    local_c68 = local_4a8;
    local_830 = (undefined1  [8])0x2a;
    local_c68 = (pointer *)std::__cxx11::string::_M_create((ulong *)local_4a0,(ulong)local_830);
    local_c58[0] = (pointer)local_830;
    builtin_strncpy((char *)local_c68,"    sb_out.r0 = sc0;\n    sb_out.r1 = sc1;\n",0x2a);
    local_c60 = (pointer)local_830;
    *(char *)((long)local_c68 + (long)local_830) = '\0';
    local_628.size = 4;
    local_628.offset = 0;
    local_628.value.m_data = 0x417c0000;
    local_348.size = 4;
    local_348.offset = 4;
    local_348.value.m_data = 0x3f900000;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_4b0,&local_628,&local_348);
    puVar4 = local_5c8;
    local_c30 = 0;
    local_c28 = local_5c8;
    pcVar10 = (char *)((long)local_5c8 + 4);
    pcVar10[0] = 'l';
    pcVar10[1] = 'e';
    *(undefined4 *)puVar4 = 0x62756f64;
    local_c20 = 6;
    local_c18[0]._0_7_ = (uint7)(uint6)local_c18[0];
    local_5f0._0_8_ = local_5e0;
    local_6d8 = (undefined1  [8])0x36;
    local_5f0._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_5f0,(ulong)local_6d8);
    local_5e0[0] = (ulong)local_6d8;
    *(undefined8 *)(local_5f0._0_8_ + 0x20) = 0x656c62756f642074;
    *(undefined8 *)(local_5f0._0_8_ + 0x28) = 0x32203d2030637320;
    *(undefined8 *)(local_5f0._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_5f0._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_5f0._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_5f0._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_5f0._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_5f0._0_8_ + 0xc),"ant_",4);
    builtin_strncpy((char *)(local_5f0._0_8_ + 0x2e)," 2.75LF;",8);
    local_5f0.value.m_data = (deUint64)local_6d8;
    *(char *)(local_5f0._0_8_ + (long)local_6d8) = '\0';
    local_830._0_4_ = 1;
    local_828._M_p = (pointer)&local_818;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_828,local_5f0._0_8_,(char *)(local_5f0._0_8_ + (long)local_6d8));
    local_808 = 8;
    local_800.m_data = 0x4036800000000000;
    local_610._0_8_ = local_600;
    local_5c0._0_8_ = (pointer *)0x36;
    local_610._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_610,(ulong)&local_5c0);
    local_600[0] = (pointer *)local_5c0._0_8_;
    *(undefined8 *)(local_610._0_8_ + 0x20) = 0x656c62756f642074;
    *(undefined8 *)(local_610._0_8_ + 0x28) = 0x39203d2031637320;
    *(undefined8 *)(local_610._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_610._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_610._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_610._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_610._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_610._0_8_ + 0xc),"ant_",4);
    builtin_strncpy((char *)(local_610._0_8_ + 0x2e)," 9.25LF;",8);
    local_610.value.m_data._0_4_ = local_5c0.size;
    local_610.value.m_data._4_4_ = local_5c0.offset;
    *(char *)(local_610._0_8_ + local_5c0._0_8_) = '\0';
    local_6d8._0_4_ = 2;
    local_6d0._M_p = (pointer)&local_6c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6d0,local_610._0_8_,(char *)(local_610._0_8_ + local_5c0._0_8_));
    local_6b0 = 0;
    local_6a8.m_data = 0;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_640,(SpecConstant *)local_830,(SpecConstant *)local_6d8);
    local_bf0 = 0x10;
    local_be8 = local_4f0;
    local_5c0._0_8_ = (pointer *)0x1e;
    local_be8 = (ulong *)std::__cxx11::string::_M_create((ulong *)local_3c8,(ulong)&local_5c0);
    local_bd8 = (pointer *)local_5c0._0_8_;
    builtin_strncpy((char *)local_be8,"    double r0;\n    double r1;\n",0x1e);
    local_be0 = (pointer *)local_5c0._0_8_;
    *(char *)((long)local_be8 + local_5c0._0_8_) = '\0';
    local_bc8 = local_4b8;
    local_bc0 = 0;
    local_bb8[0] = 0;
    local_ba8 = local_4c8;
    local_5c0._0_8_ = (pointer *)0x2a;
    local_ba8 = (pointer **)std::__cxx11::string::_M_create((ulong *)local_4c0,(ulong)&local_5c0);
    local_b98[0] = (pointer *)local_5c0._0_8_;
    builtin_strncpy((char *)local_ba8,"    sb_out.r0 = sc0;\n    sb_out.r1 = sc1;\n",0x2a);
    local_ba0 = (pointer *)local_5c0._0_8_;
    *(char *)((long)local_ba8 + local_5c0._0_8_) = '\0';
    local_5c0.size = 8;
    local_5c0.offset = 0;
    local_5c0.value.m_data = 0x4036800000000000;
    local_358.size = 8;
    local_358.offset = 8;
    local_358.value.m_data = 0x4022800000000000;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_4d0,&local_5c0,&local_358);
    local_b70 = 4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6d0._M_p != &local_6c0) {
      operator_delete(local_6d0._M_p,local_6c0._M_allocated_capacity + 1);
    }
    if ((pointer **)local_610._0_8_ != local_600) {
      operator_delete((void *)local_610._0_8_,(long)local_600[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_828._M_p != &local_818) {
      operator_delete(local_828._M_p,local_818._M_allocated_capacity + 1);
    }
    if ((ulong *)local_5f0._0_8_ != local_5e0) {
      operator_delete((void *)local_5f0._0_8_,local_5e0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d0._M_p != &local_8c0) {
      operator_delete(local_8d0._M_p,local_8c0._M_allocated_capacity + 1);
    }
    if (local_6a0 != local_690) {
      operator_delete(local_6a0,local_690[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7f0._M_p != &local_7e0) {
      operator_delete(local_7f0._M_p,local_7e0._M_allocated_capacity + 1);
    }
    if (local_680 != local_670) {
      operator_delete(local_680,local_670[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_898._M_p != &local_888) {
      operator_delete(local_898._M_p,local_888._M_allocated_capacity + 1);
    }
    if (local_660 != local_650) {
      operator_delete(local_660,local_650[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b8._M_p != &local_7a8) {
      operator_delete(local_7b8._M_p,local_7a8._M_allocated_capacity + 1);
    }
    if ((pointer *)local_8f8._0_8_ != local_8e8) {
      operator_delete((void *)local_8f8._0_8_,(ulong)(local_8e8[0] + 1));
    }
    if (local_860._M_p != local_858 + 8) {
      operator_delete(local_860._M_p,local_858._8_8_ + 1);
    }
    if ((pointer *)local_788._0_8_ != local_778) {
      operator_delete((void *)local_788._0_8_,(ulong)(local_778[0] + 1));
    }
    if (local_928._M_p != local_920 + 8) {
      operator_delete(local_928._M_p,local_920._8_8_ + 1);
    }
    if ((pointer *)local_768._0_8_ != local_758) {
      operator_delete((void *)local_768._0_8_,(ulong)(local_758[0] + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_960._M_p != &local_950) {
      operator_delete(local_960._M_p,local_950._M_allocated_capacity + 1);
    }
    if ((pointer *)local_748._0_8_ != local_738) {
      operator_delete((void *)local_748._0_8_,(ulong)(local_738[0] + 1));
    }
    if (local_9b8._M_p != local_9b0 + 8) {
      operator_delete(local_9b8._M_p,local_9b0._8_8_ + 1);
    }
    if ((pointer *)local_728._0_8_ != local_718) {
      operator_delete((void *)local_728._0_8_,(ulong)(local_718[0] + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f58._M_p != &local_f48) {
      operator_delete(local_f58._M_p,local_f48._M_allocated_capacity + 1);
    }
    if ((pointer *)local_708._0_8_ != local_6f8) {
      operator_delete((void *)local_708._0_8_,(ulong)(local_6f8[0] + 1));
    }
    if (local_5a8._M_p != local_598) {
      operator_delete(local_5a8._M_p,local_598._0_8_ + 1);
    }
    if ((pointer *)local_988._0_8_ != local_978) {
      operator_delete((void *)local_988._0_8_,(ulong)(local_978[0] + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_p != &local_320) {
      operator_delete(local_330._M_p,local_320._M_allocated_capacity + 1);
    }
    if (local_9e0 != local_9d0) {
      operator_delete(local_9e0,(long)local_9d0[0] + 1);
    }
    lVar17 = 0;
    do {
      pSVar9 = (SpecConstantTest *)operator_new(0x138);
      anon_unknown_0::SpecConstantTest::SpecConstantTest
                (pSVar9,local_1038,VVar1,(CaseDefinition *)(local_f28 + lVar17));
      tcu::TestNode::addChild(pTVar8,(TestNode *)pSVar9);
      lVar17 = lVar17 + 0xc0;
    } while (lVar17 != 0x3c0);
    lVar17 = 0x300;
    do {
      anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)(local_f28 + lVar17));
      lVar17 = lVar17 + -0xc0;
    } while (lVar17 != -0xc0);
    tcu::TestNode::addChild(local_6e0,pTVar8);
    VVar1 = *(VkShaderStageFlagBits *)(local_fe8 + 2);
    pTVar8 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,local_1038,"builtin","built-in override");
    local_f28._0_8_ = local_f28 + 0x10;
    local_f28._16_8_ = 0x746c7561666564;
    local_f28._8_8_ = 7;
    local_f60 = (undefined1  [8])&local_f50;
    local_5b0 = (undefined1  [8])0x2d;
    local_f60 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_f60,(ulong)local_5b0);
    local_f50 = (pointer)local_5b0;
    builtin_strncpy((char *)((long)local_f60 + 0x1d),"l_MaxIma",8);
    builtin_strncpy((char *)((long)local_f60 + 0x25),"geUnits;",8);
    *(undefined8 *)((long)local_f60 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_f60 + 0x18) = 0x4d5f6c6720297d44;
    *(undefined4 *)local_f60 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_f60 + 4),"ut(c",4);
    *(undefined4 *)((long)local_f60 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_f60 + 0xc),"ant_",4);
    local_f58._M_p = (pointer)local_5b0;
    *(char *)((long)local_f60 + (long)local_5b0) = '\0';
    local_338._0_4_ = 1;
    local_330._M_p = (pointer)&local_320;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_330,local_f60,(pointer)((long)local_5b0 + (long)local_f60));
    local_310 = 0;
    local_308.m_data = 0;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              ((vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
                *)(local_f28 + 0x20),(SpecConstant *)local_338);
    local_f28._56_8_ = 4;
    local_ee8._M_p = (pointer)&local_ed8;
    local_ed8._8_5_ = 0xa3b6b6f20;
    local_ed8._M_allocated_capacity._0_5_ = 0x6220202020;
    local_ed8._M_allocated_capacity._5_3_ = 0x6c6f6f;
    local_ee0 = (pointer)0xd;
    local_ed8._M_local_buf[0xd] = '\0';
    local_ec8._M_p = (pointer)&local_eb8;
    local_ec0 = (pointer)0x0;
    local_eb8._M_allocated_capacity = local_eb8._M_allocated_capacity & 0xffffffffffffff00;
    local_ea8._M_p = (pointer)local_1008;
    local_5b0 = (undefined1  [8])0x29;
    local_ea8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)local_1000,(ulong)local_5b0);
    local_e98._M_allocated_capacity = (size_type)local_5b0;
    builtin_strncpy(local_ea8._M_p,"    sb_out.ok = (gl_MaxImageUnits >= 8);\n",0x29);
    local_ea0 = (pointer)local_5b0;
    local_ea8._M_p[(long)local_5b0] = '\0';
    local_968 = (undefined1  [8])0x4;
    local_960._M_p = &DAT_00000001;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (local_ff0,(OffsetValue *)local_968);
    local_e70 = 0;
    local_e68 = local_fc0;
    *local_fc0 = 0x696c616963657073;
    *(undefined4 *)((long)local_fc0 + 7) = 0x64657a69;
    local_e60 = 0xb;
    local_e4d = 0;
    local_9c0 = (undefined1  [8])local_9b0;
    local_930 = (undefined1  [8])0x2d;
    local_9c0 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_9c0,(ulong)local_930);
    local_9b0._0_8_ = local_930;
    builtin_strncpy((char *)local_9c0,"layout(constant_id = ${ID}) gl_MaxImageUnits;",0x2d);
    local_9b8._M_p = (pointer)local_930;
    *(char *)((long)local_9c0 + (long)local_930) = '\0';
    local_5b0._0_4_ = 1;
    local_5a8._M_p = local_598;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5a8,local_9c0,(pointer)((long)local_930 + (long)local_9c0));
    local_588 = 4;
    local_580.m_data = 0xc;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_6e8,(SpecConstant *)local_5b0);
    local_e30 = 4;
    local_e28 = local_fd0;
    local_930 = (undefined1  [8])0x17;
    local_e28 = (pointer *)std::__cxx11::string::_M_create((ulong *)local_fd8,(ulong)local_930);
    local_e18[0] = (pointer)local_930;
    builtin_strncpy((char *)local_e28,"    int maxImageUnits;\n",0x17);
    local_e20 = (pointer)local_930;
    *(char *)((long)local_e28 + (long)local_930) = '\0';
    local_e08 = local_fc8;
    local_e00 = 0;
    local_df8[0] = 0;
    local_de8 = local_fb0;
    local_930 = (undefined1  [8])0x2d;
    local_de8 = (pointer *)std::__cxx11::string::_M_create((ulong *)local_fb8,(ulong)local_930);
    local_dd8[0] = (pointer)local_930;
    builtin_strncpy((char *)local_de8,"    sb_out.maxImageUnits = gl_MaxImageUnits;\n",0x2d);
    local_de0 = (pointer)local_930;
    *(char *)((long)local_de8 + (long)local_930) = '\0';
    local_930 = (undefined1  [8])0x4;
    local_928._M_p = (pointer)0xc;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (local_f98,(OffsetValue *)local_930);
    local_db0 = 0;
    if (local_5a8._M_p != local_598) {
      operator_delete(local_5a8._M_p,local_598._0_8_ + 1);
    }
    if (local_9c0 != (undefined1  [8])local_9b0) {
      operator_delete((void *)local_9c0,(ulong)(local_9b0._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_p != &local_320) {
      operator_delete(local_330._M_p,local_320._M_allocated_capacity + 1);
    }
    if (local_f60 != (undefined1  [8])&local_f50) {
      operator_delete((void *)local_f60,(ulong)(local_f50 + 1));
    }
    lVar17 = 0;
    do {
      pSVar9 = (SpecConstantTest *)operator_new(0x138);
      anon_unknown_0::SpecConstantTest::SpecConstantTest
                (pSVar9,local_1038,VVar1,(CaseDefinition *)(local_f28 + lVar17));
      tcu::TestNode::addChild(pTVar8,(TestNode *)pSVar9);
      lVar17 = lVar17 + 0xc0;
    } while (lVar17 == 0xc0);
    lVar17 = 0xc0;
    do {
      anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)(local_f28 + lVar17));
      lVar17 = lVar17 + -0xc0;
    } while (lVar17 != -0xc0);
    tcu::TestNode::addChild(local_6e0,pTVar8);
    VVar1 = *(VkShaderStageFlagBits *)(local_fe8 + 2);
    pTVar8 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,local_1038,"expression",
               "specialization constants usage in expressions");
    local_f28._0_8_ = local_f28 + 0x10;
    local_338 = (undefined1  [8])0x15;
    local_f28._0_8_ = std::__cxx11::string::_M_create((ulong *)local_f28,(ulong)local_338);
    local_f28._16_8_ = local_338;
    builtin_strncpy((char *)local_f28._0_8_,"spec_const_expression",0x15);
    local_f28._8_8_ = local_338;
    *(char *)(local_f28._0_8_ + (long)local_338) = '\0';
    local_6d8 = (undefined1  [8])&local_6c8;
    local_5b0 = (undefined1  [8])0x2e;
    local_6d8 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_6d8,(ulong)local_5b0);
    local_6c8 = (pointer)local_5b0;
    builtin_strncpy((char *)((long)local_6d8 + 0x1e),"nst int ",8);
    builtin_strncpy((char *)((long)local_6d8 + 0x26),"sc0 = 2;",8);
    *(undefined8 *)((long)local_6d8 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_6d8 + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_6d8 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_6d8 + 4),"ut(c",4);
    *(undefined4 *)((long)local_6d8 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_6d8 + 0xc),"ant_",4);
    local_6d0._M_p = (pointer)local_5b0;
    *(char *)((long)local_6d8 + (long)local_5b0) = '\0';
    local_338._0_4_ = 1;
    local_330._M_p = (pointer)&local_320;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_330,local_6d8,(pointer)((long)local_5b0 + (long)local_6d8));
    local_310 = 0;
    local_308.m_data = 0;
    local_9e0 = local_9d0;
    local_f60 = (undefined1  [8])0x2e;
    local_9e0 = (pointer **)std::__cxx11::string::_M_create((ulong *)&local_9e0,(ulong)local_f60);
    local_9d0[0] = (pointer *)local_f60;
    builtin_strncpy((char *)((long)local_9e0 + 0x1e),"nst int ",8);
    builtin_strncpy((char *)((long)local_9e0 + 0x26),"sc1 = 3;",8);
    local_9e0[2] = (pointer *)0x497b24203d206469;
    local_9e0[3] = (pointer *)0x736e6f6320297d44;
    *(undefined4 *)local_9e0 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_9e0 + 4),"ut(c",4);
    *(undefined4 *)(local_9e0 + 1) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_9e0 + 0xc),"ant_",4);
    local_9d8 = (pointer *)local_f60;
    *(char *)((long)local_9e0 + (long)local_f60) = '\0';
    local_5b0._0_4_ = 2;
    local_5a8._M_p = local_598;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5a8,local_9e0,(char *)((long)local_f60 + (long)local_9e0));
    local_588 = 4;
    local_580.m_data = 5;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              ((vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
                *)(local_f28 + 0x20),(SpecConstant *)local_338,(SpecConstant *)local_5b0);
    local_f28._56_8_ = 4;
    local_ee8._M_p = (pointer)&local_ed8;
    local_f60 = (undefined1  [8])0x10;
    local_ee8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)&local_ee8,(ulong)local_f60);
    local_ed8._M_allocated_capacity._0_5_ = local_f60._0_5_;
    local_ed8._M_allocated_capacity._5_3_ = local_f60._5_3_;
    builtin_strncpy(local_ee8._M_p,"    int result;\n",0x10);
    local_ee0 = (pointer)local_f60;
    local_ee8._M_p[(long)local_f60] = '\0';
    local_ec8._M_p = (pointer)&local_eb8;
    local_f60 = (undefined1  [8])0x38;
    local_ec8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)&local_ec8,(ulong)local_f60);
    local_eb8._M_allocated_capacity = (size_type)local_f60;
    builtin_strncpy(local_ec8._M_p,"const int expr0 = sc0 + 1;\nconst int expr1 = sc0 + sc1;\n",0x38
                   );
    local_ec0 = (pointer)local_f60;
    local_ec8._M_p[(long)local_f60] = '\0';
    local_ea8._M_p = (pointer)local_1008;
    local_f60 = (undefined1  [8])0x23;
    local_ea8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)local_1000,(ulong)local_f60);
    local_e98._M_allocated_capacity = (size_type)local_f60;
    builtin_strncpy(local_ea8._M_p,"    sb_out.result = expr0 + expr1;\n",0x23);
    local_ea0 = (pointer)local_f60;
    local_ea8._M_p[(long)local_f60] = '\0';
    local_5f0._0_8_ = (ulong *)0x4;
    local_5f0.value.m_data = 10;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_ff0,&local_5f0);
    local_e70 = 0;
    local_e68 = local_fc0;
    *local_fc0 = 0x69735f7961727261;
    *(undefined2 *)(local_fc0 + 1) = 0x657a;
    local_e60 = 10;
    uStack_e4e = 0;
    local_988._0_8_ = local_978;
    local_9c0 = (undefined1  [8])0x2e;
    local_988._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_988,(ulong)local_9c0);
    local_978[0] = (pointer)local_9c0;
    builtin_strncpy((char *)(local_988._0_8_ + 0x1e),"nst int ",8);
    builtin_strncpy((char *)(local_988._0_8_ + 0x26),"sc0 = 1;",8);
    *(undefined8 *)(local_988._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_988._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_988._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_988._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_988._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_988._0_8_ + 0xc),"ant_",4);
    local_988.value.m_data = (deUint64)local_9c0;
    *(char *)(local_988._0_8_ + (long)local_9c0) = '\0';
    local_f60._0_4_ = 1;
    local_f58._M_p = (pointer)&local_f48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f58,local_988._0_8_,(pointer)((long)local_9c0 + local_988._0_8_));
    local_f38 = 0;
    local_f30.m_data = 0;
    local_708._0_8_ = local_6f8;
    local_968 = (undefined1  [8])0x2e;
    local_708._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_708,(ulong)local_968);
    local_6f8[0] = (pointer)local_968;
    builtin_strncpy((char *)(local_708._0_8_ + 0x1e),"nst int ",8);
    builtin_strncpy((char *)(local_708._0_8_ + 0x26),"sc1 = 2;",8);
    *(undefined8 *)(local_708._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_708._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_708._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_708._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_708._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_708._0_8_ + 0xc),"ant_",4);
    local_708.value.m_data = (deUint64)local_968;
    *(char *)(local_708._0_8_ + (long)local_968) = '\0';
    local_9c0._0_4_ = 2;
    local_9b8._M_p = local_9b0 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_9b8,local_708._0_8_,(pointer)((long)local_968 + local_708._0_8_));
    local_998 = 4;
    local_990.m_data = 3;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_6e8,(SpecConstant *)local_f60,(SpecConstant *)local_9c0);
    local_e30 = 0x10;
    local_e28 = local_fd0;
    local_968 = (undefined1  [8])0x1b;
    local_e28 = (pointer *)std::__cxx11::string::_M_create((ulong *)local_fd8,(ulong)local_968);
    local_e18[0] = (pointer)local_968;
    builtin_strncpy((char *)((long)local_e28 + 0xb),"\n    int",8);
    builtin_strncpy((char *)((long)local_e28 + 0x13)," r1[3];\n",8);
    *local_e28 = (pointer)0x20746e6920202020;
    local_e28[1] = (pointer)0x202020200a3b3072;
    local_e20 = (pointer)local_968;
    *(char *)((long)local_e28 + (long)local_968) = '\0';
    local_e08 = local_fc8;
    local_e00 = 0;
    local_df8[0] = 0;
    local_de8 = local_fb0;
    local_968 = (undefined1  [8])0xef;
    local_de8 = (pointer *)std::__cxx11::string::_M_create((ulong *)local_fb8,(ulong)local_968);
    auVar3 = local_968;
    local_dd8[0] = (pointer)local_968;
    memcpy(local_de8,
           "    int a0[sc0];\n    int a1[sc1];\n\n    for (int i = 0; i < sc0; ++i)\n        a0[i] = sc0 - i;\n    for (int i = 0; i < sc1; ++i)\n        a1[i] = sc1 - i;\n\n    sb_out.r0 = a0[0];\n    for (int i = 0; i < sc1; ++i)\n\t     sb_out.r1[i] = a1[i];\n"
           ,0xef);
    local_de0 = (pointer)auVar3;
    *(char *)((long)local_de8 + (long)auVar3) = '\0';
    local_610._0_8_ = (pointer **)0x4;
    local_610.value.m_data = 1;
    local_470._0_8_ = (deUint64 *)0x400000004;
    local_470.value.m_data = 3;
    local_3e0.size = 4;
    local_3e0.offset = 8;
    local_3e0.value.m_data = 2;
    local_3f0.size = 4;
    local_3f0.offset = 0xc;
    local_3f0.value.m_data = 1;
    o4 = &local_3f0;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (local_f98,&local_610,&local_470,&local_3e0,o4);
    local_db0 = 0;
    local_da8 = local_f78;
    local_968 = (undefined1  [8])0x15;
    local_da8 = (long *)std::__cxx11::string::_M_create((ulong *)&local_da8,(ulong)local_968);
    local_d98[0] = (long)local_968;
    *local_da8 = 0x69735f7961727261;
    local_da8[1] = 0x65727078655f657a;
    builtin_strncpy((char *)((long)local_da8 + 0xd),"pression",8);
    local_da0 = (long)local_968;
    *(char *)((long)local_da8 + (long)local_968) = '\0';
    local_728._0_8_ = local_718;
    local_930 = (undefined1  [8])0x2e;
    local_728._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_728,(ulong)local_930);
    local_718[0] = (pointer)local_930;
    builtin_strncpy((char *)(local_728._0_8_ + 0x1e),"nst int ",8);
    builtin_strncpy((char *)(local_728._0_8_ + 0x26),"sc0 = 3;",8);
    *(undefined8 *)(local_728._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_728._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_728._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_728._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_728._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_728._0_8_ + 0xc),"ant_",4);
    local_728.value.m_data = (deUint64)local_930;
    *(char *)(local_728._0_8_ + (long)local_930) = '\0';
    local_968._0_4_ = 1;
    local_960._M_p = (pointer)&local_950;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_960,local_728._0_8_,(pointer)((long)local_930 + local_728._0_8_));
    local_940 = 0;
    local_938.m_data = 0;
    local_748._0_8_ = local_738;
    local_868 = (undefined1  [8])0x2e;
    local_748._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_748,(ulong)local_868);
    local_738[0] = (pointer)local_868;
    builtin_strncpy((char *)(local_748._0_8_ + 0x1e),"nst int ",8);
    builtin_strncpy((char *)(local_748._0_8_ + 0x26),"sc1 = 5;",8);
    *(undefined8 *)(local_748._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_748._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_748._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_748._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_748._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_748._0_8_ + 0xc),"ant_",4);
    local_748.value.m_data = (deUint64)local_868;
    *(char *)(local_748._0_8_ + (long)local_868) = '\0';
    local_930._0_4_ = 2;
    local_928._M_p = local_920 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_928,local_748._0_8_,(pointer)((long)local_868 + local_748._0_8_));
    local_908 = 4;
    local_900.m_data = 7;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_630,(SpecConstant *)local_968,(SpecConstant *)local_930);
    local_d70 = 8;
    local_d68 = local_f68;
    local_868 = (undefined1  [8])0x18;
    local_d68 = (pointer *)std::__cxx11::string::_M_create((ulong *)local_3b8,(ulong)local_868);
    local_d58 = (pointer)local_868;
    *local_d68 = (pointer)0x20746e6920202020;
    local_d68[1] = (pointer)0x202020200a3b3072;
    local_d68[2] = (pointer)0xa3b317220746e69;
    local_d60 = (pointer)local_868;
    *(char *)((long)local_d68 + (long)local_868) = '\0';
    local_d48 = local_478;
    local_d40 = 0;
    local_d38[0] = 0;
    local_d28 = local_488;
    local_868 = (undefined1  [8])0x123;
    local_d28 = (pointer *)std::__cxx11::string::_M_create((ulong *)local_480,(ulong)local_868);
    auVar3 = local_868;
    local_d18[0] = (pointer)local_868;
    memcpy(local_d28,
           "    int a0[sc0 + 3];\n    int a1[sc0 + sc1];\n\n    const int size0 = sc0 + 3;\n    const int size1 = sc0 + sc1;\n\n    for (int i = 0; i < size0; ++i)\n        a0[i] = 3 - i;\n    for (int i = 0; i < size1; ++i)\n        a1[i] = 5 - i;\n\n    sb_out.r0 = a0[size0 - 1];\n    sb_out.r1 = a1[size1 - 1];\n"
           ,0x123);
    local_d20 = (pointer)auVar3;
    *(char *)((long)local_d28 + (long)auVar3) = '\0';
    local_400.size = 4;
    local_400.offset = 0;
    local_400.value.m_data = 0xfffffffe;
    local_410.size = 4;
    local_410.offset = 4;
    local_410.value.m_data = 0xfffffffc;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_490,&local_400,&local_410);
    local_cf0 = 0;
    local_ce8 = local_f80;
    local_868 = (undefined1  [8])0x20;
    local_ce8 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_ce8,(ulong)local_868);
    local_cd8[0] = (pointer)local_868;
    local_ce8[2] = (pointer)0x78655f74736e6f63;
    local_ce8[3] = (pointer)0x6e6f697373657270;
    *local_ce8 = (pointer)0x69735f7961727261;
    local_ce8[1] = (pointer)0x5f636570735f657a;
    local_ce0 = (pointer)local_868;
    *(char *)((long)local_ce8 + (long)local_868) = '\0';
    local_768._0_8_ = local_758;
    local_7c0 = (undefined1  [8])0x2e;
    local_768._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_768,(ulong)local_7c0);
    local_758[0] = (pointer)local_7c0;
    builtin_strncpy((char *)(local_768._0_8_ + 0x1e),"nst int ",8);
    builtin_strncpy((char *)(local_768._0_8_ + 0x26),"sc0 = 3;",8);
    *(undefined8 *)(local_768._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_768._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_768._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_768._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_768._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_768._0_8_ + 0xc),"ant_",4);
    local_768.value.m_data = (deUint64)local_7c0;
    *(char *)(local_768._0_8_ + (long)local_7c0) = '\0';
    local_868._0_4_ = 1;
    local_860._M_p = local_858 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_860,local_768._0_8_,(char *)(local_768._0_8_ + (long)local_7c0));
    local_840 = 0;
    local_838.m_data = 0;
    local_788._0_8_ = local_778;
    local_8a0 = (undefined1  [8])0x2e;
    local_788._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_788,(ulong)local_8a0);
    local_778[0] = (pointer)local_8a0;
    builtin_strncpy((char *)(local_788._0_8_ + 0x1e),"nst int ",8);
    builtin_strncpy((char *)(local_788._0_8_ + 0x26),"sc1 = 5;",8);
    *(undefined8 *)(local_788._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_788._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_788._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_788._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_788._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_788._0_8_ + 0xc),"ant_",4);
    local_788.value.m_data = (deUint64)local_8a0;
    *(char *)(local_788._0_8_ + (long)local_8a0) = '\0';
    local_7c0._0_4_ = 2;
    local_7b8._M_p = (pointer)&local_7a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7b8,local_788._0_8_,(pointer)((long)local_8a0 + local_788._0_8_));
    local_798 = 4;
    local_790.m_data = 7;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_638,(SpecConstant *)local_868,(SpecConstant *)local_7c0);
    local_cb0 = 8;
    local_ca8 = local_4e8;
    local_8a0 = (undefined1  [8])0x18;
    local_ca8 = (ulong *)std::__cxx11::string::_M_create((ulong *)local_3c0,(ulong)local_8a0);
    local_c98 = (ulong)local_8a0;
    *local_ca8 = 0x20746e6920202020;
    local_ca8[1] = 0x202020200a3b3072;
    local_ca8[2] = 0xa3b317220746e69;
    local_ca0 = (ulong)local_8a0;
    *(char *)((long)local_ca8 + (long)local_8a0) = '\0';
    local_c88 = local_498;
    local_c80 = 0;
    local_c78[0] = 0;
    local_c68 = local_4a8;
    local_8a0 = (undefined1  [8])0x11d;
    local_c68 = (pointer *)std::__cxx11::string::_M_create((ulong *)local_4a0,(ulong)local_8a0);
    auVar3 = local_8a0;
    local_c58[0] = (pointer)local_8a0;
    memcpy(local_c68,
           "    const int size0 = sc0 + 3;\n    const int size1 = sc0 + sc1;\n\n    int a0[size0];\n    int a1[size1];\n\n    for (int i = 0; i < size0; ++i)\n        a0[i] = 3 - i;\n    for (int i = 0; i < size1; ++i)\n        a1[i] = 5 - i;\n\n    sb_out.r0 = a0[size0 - 1];\n    sb_out.r1 = a1[size1 - 1];\n"
           ,0x11d);
    local_c60 = (pointer)auVar3;
    *(char *)((long)local_c68 + (long)auVar3) = '\0';
    local_420.size = 4;
    local_420.offset = 0;
    local_420.value.m_data = 0xfffffffe;
    local_430.size = 4;
    local_430.offset = 4;
    local_430.value.m_data = 0xfffffffc;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_4b0,&local_420,&local_430);
    local_c30 = 0;
    local_c28 = local_5c8;
    local_8a0 = (undefined1  [8])0x11;
    local_c28 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_c28,(ulong)local_8a0);
    local_c18[0] = (ulong)local_8a0;
    *local_c28 = 0x69735f7961727261;
    local_c28[1] = 0x74676e656c5f657a;
    *(char *)(local_c28 + 2) = 'h';
    local_c20 = (ulong)local_8a0;
    *(char *)((long)local_c28 + (long)local_8a0) = '\0';
    local_8f8._0_8_ = local_8e8;
    local_7f8 = (undefined1  [8])0x2e;
    local_8f8._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_8f8,(ulong)local_7f8);
    local_8e8[0] = (pointer)local_7f8;
    builtin_strncpy((char *)(local_8f8._0_8_ + 0x1e),"nst int ",8);
    builtin_strncpy((char *)(local_8f8._0_8_ + 0x26),"sc0 = 1;",8);
    *(undefined8 *)(local_8f8._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_8f8._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_8f8._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_8f8._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_8f8._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_8f8._0_8_ + 0xc),"ant_",4);
    local_8f8.value.m_data = (deUint64)local_7f8;
    *(char *)(local_8f8._0_8_ + (long)local_7f8) = '\0';
    local_8a0._0_4_ = 1;
    local_898._M_p = (pointer)&local_888;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_898,local_8f8._0_8_,(pointer)((long)local_7f8 + local_8f8._0_8_));
    local_878 = 0;
    local_870.m_data = 0;
    local_660 = local_650;
    local_8d8 = (undefined1  [8])0x2e;
    local_660 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_660,(ulong)local_8d8);
    local_650[0] = (ulong)local_8d8;
    builtin_strncpy((char *)((long)local_660 + 0x1e),"nst int ",8);
    builtin_strncpy((char *)((long)local_660 + 0x26),"sc1 = 2;",8);
    local_660[2] = 0x497b24203d206469;
    local_660[3] = 0x736e6f6320297d44;
    *(undefined4 *)local_660 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_660 + 4),"ut(c",4);
    *(undefined4 *)(local_660 + 1) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_660 + 0xc),"ant_",4);
    local_658 = (ulong)local_8d8;
    *(char *)((long)local_660 + (long)local_8d8) = '\0';
    local_7f8._0_4_ = 2;
    local_7f0._M_p = (pointer)&local_7e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7f0,local_660,(char *)((long)local_660 + (long)local_8d8));
    local_7d0 = 4;
    local_7c8.m_data = 4;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_640,(SpecConstant *)local_8a0,(SpecConstant *)local_7f8);
    local_bf0 = 8;
    local_be8 = local_4f0;
    local_8d8 = (undefined1  [8])0x18;
    local_be8 = (ulong *)std::__cxx11::string::_M_create((ulong *)local_3c8,(ulong)local_8d8);
    local_bd8 = (pointer *)local_8d8;
    *local_be8 = 0x20746e6920202020;
    ((pointer **)local_be8)[1] = (pointer *)0x202020200a3b3072;
    ((pointer **)local_be8)[2] = (pointer *)0xa3b317220746e69;
    local_be0 = (pointer *)local_8d8;
    *(char *)((long)local_be8 + (long)local_8d8) = '\0';
    local_bc8 = local_4b8;
    local_bc0 = 0;
    local_bb8[0] = 0;
    local_ba8 = local_4c8;
    local_8d8 = (undefined1  [8])0x5d;
    local_ba8 = (pointer **)std::__cxx11::string::_M_create((ulong *)local_4c0,(ulong)local_8d8);
    auVar3 = local_8d8;
    local_b98[0] = (pointer *)local_8d8;
    memcpy(local_ba8,
           "    int a0[sc0];\n    int a1[sc1];\n\n    sb_out.r0 = a0.length();\n    sb_out.r1 = a1.length();\n"
           ,0x5d);
    local_ba0 = (pointer *)auVar3;
    *(undefined1 *)((long)local_ba8 + (long)auVar3) = 0;
    local_440.size = 4;
    local_440.offset = 0;
    local_440.value.m_data = 1;
    local_450.size = 4;
    local_450.offset = 4;
    local_450.value.m_data = 4;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_4d0,&local_440,&local_450);
    local_b70 = 0;
    local_b68 = local_370;
    local_8d8 = (undefined1  [8])0x1b;
    local_b68 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_b68,(ulong)local_8d8);
    local_b58[0] = (ulong)local_8d8;
    builtin_strncpy((char *)((long)local_b68 + 0xb),"pass_to_",8);
    builtin_strncpy((char *)((long)local_b68 + 0x13),"function",8);
    *local_b68 = 0x69735f7961727261;
    local_b68[1] = 0x5f737361705f657a;
    local_b60 = (ulong)local_8d8;
    *(char *)((long)local_b68 + (long)local_8d8) = '\0';
    local_680 = local_670;
    local_830 = (undefined1  [8])0x2e;
    local_680 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_680,(ulong)local_830);
    local_670[0] = (ulong)local_830;
    builtin_strncpy((char *)((long)local_680 + 0x1e),"nst int ",8);
    builtin_strncpy((char *)((long)local_680 + 0x26),"sc0 = 3;",8);
    local_680[2] = 0x497b24203d206469;
    local_680[3] = 0x736e6f6320297d44;
    *(undefined4 *)local_680 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_680 + 4),"ut(c",4);
    *(undefined4 *)(local_680 + 1) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_680 + 0xc),"ant_",4);
    local_678 = (ulong)local_830;
    *(char *)((long)local_680 + (long)local_830) = '\0';
    local_8d8._0_4_ = 1;
    local_8d0._M_p = (pointer)&local_8c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_8d0,local_680,(char *)((long)local_680 + (long)local_830));
    local_8b0 = 0;
    local_8a8.m_data = 0;
    local_6a0 = local_690;
    local_628.size = 0x2e;
    local_628.offset = 0;
    local_6a0 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_6a0,(ulong)&local_628);
    local_690[0]._0_4_ = local_628.size;
    local_690[0]._4_4_ = local_628.offset;
    builtin_strncpy((char *)((long)local_6a0 + 0x1e),"nst int ",8);
    builtin_strncpy((char *)((long)local_6a0 + 0x26),"sc1 = 1;",8);
    local_6a0[2] = 0x497b24203d206469;
    local_6a0[3] = 0x736e6f6320297d44;
    *(undefined4 *)local_6a0 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_6a0 + 4),"ut(c",4);
    *(undefined4 *)(local_6a0 + 1) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_6a0 + 0xc),"ant_",4);
    local_698._0_4_ = local_628.size;
    local_698._4_4_ = local_628.offset;
    *(char *)((long)local_6a0 + local_628._0_8_) = '\0';
    local_830._0_4_ = 2;
    local_828._M_p = (pointer)&local_818;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_828,local_6a0,(char *)((long)local_6a0 + local_628._0_8_));
    local_808 = 4;
    local_800.m_data = 3;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_4d8,(SpecConstant *)local_8d8,(SpecConstant *)local_830);
    local_b30 = 4;
    local_b28 = local_380;
    local_628.size = 0x10;
    local_628.offset = 0;
    local_b28 = (long *)std::__cxx11::string::_M_create((ulong *)local_378,(ulong)&local_628);
    local_b18[0]._0_4_ = local_628.size;
    local_b18[0]._4_4_ = local_628.offset;
    *local_b28 = 0x20746e6920202020;
    local_b28[1] = 0xa3b746c75736572;
    local_b20._0_4_ = local_628.size;
    local_b20._4_4_ = local_628.offset;
    *(char *)((long)local_b28 + local_628._0_8_) = '\0';
    local_b08 = local_390;
    local_628.size = 0x9d;
    local_628.offset = 0;
    local_b08 = (long *)std::__cxx11::string::_M_create((ulong *)local_388,(ulong)&local_628);
    uVar2 = local_628._0_8_;
    local_af8[0]._0_4_ = local_628.size;
    local_af8[0]._4_4_ = local_628.offset;
    memcpy(local_b08,
           "int sumArrays (int a0[sc0], int a1[sc1])\n{\n    int sum = 0;\n    for (int i = 0; (i < sc0) && (i < sc1); ++i)\n        sum += a0[i] + a1[i];\n    return sum;\n}\n"
           ,0x9d);
    local_628.size = (deUint32)uVar2;
    local_628.offset = SUB84(uVar2,4);
    local_b00._0_4_ = local_628.size;
    local_b00._4_4_ = local_628.offset;
    *(undefined1 *)((long)local_b08 + uVar2) = 0;
    local_ae8 = local_3a0;
    local_628.size = 0xbd;
    local_628.offset = 0;
    local_ae8 = (long *)std::__cxx11::string::_M_create((ulong *)local_398,(ulong)&local_628);
    uVar2 = local_628._0_8_;
    local_ad8[0]._0_4_ = local_628.size;
    local_ad8[0]._4_4_ = local_628.offset;
    memcpy(local_ae8,
           "    int a0[sc0];\n    int a1[sc1];\n\n    for (int i = 0; i < sc0; ++i)\n        a0[i] = i + 1;\n    for (int i = 0; i < sc1; ++i)\n        a1[i] = i + 2;\n\n    sb_out.result = sumArrays(a0, a1);\n"
           ,0xbd);
    local_628.size = (deUint32)uVar2;
    local_628.offset = SUB84(uVar2,4);
    local_ae0._0_4_ = local_628.size;
    local_ae0._4_4_ = local_628.offset;
    *(undefined1 *)((long)local_ae8 + uVar2) = 0;
    local_628.size = 4;
    local_628.offset = 0;
    local_628.value.m_data = 0xf;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_3a8,&local_628);
    local_ab0 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_828._M_p != &local_818) {
      operator_delete(local_828._M_p,local_818._M_allocated_capacity + 1);
    }
    if (local_6a0 != local_690) {
      operator_delete(local_6a0,local_690[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d0._M_p != &local_8c0) {
      operator_delete(local_8d0._M_p,local_8c0._M_allocated_capacity + 1);
    }
    if (local_680 != local_670) {
      operator_delete(local_680,local_670[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7f0._M_p != &local_7e0) {
      operator_delete(local_7f0._M_p,local_7e0._M_allocated_capacity + 1);
    }
    if (local_660 != local_650) {
      operator_delete(local_660,local_650[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_898._M_p != &local_888) {
      operator_delete(local_898._M_p,local_888._M_allocated_capacity + 1);
    }
    if ((pointer *)local_8f8._0_8_ != local_8e8) {
      operator_delete((void *)local_8f8._0_8_,(ulong)(local_8e8[0] + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b8._M_p != &local_7a8) {
      operator_delete(local_7b8._M_p,local_7a8._M_allocated_capacity + 1);
    }
    if ((pointer *)local_788._0_8_ != local_778) {
      operator_delete((void *)local_788._0_8_,(ulong)(local_778[0] + 1));
    }
    if (local_860._M_p != local_858 + 8) {
      operator_delete(local_860._M_p,local_858._8_8_ + 1);
    }
    if ((pointer *)local_768._0_8_ != local_758) {
      operator_delete((void *)local_768._0_8_,(ulong)(local_758[0] + 1));
    }
    if (local_928._M_p != local_920 + 8) {
      operator_delete(local_928._M_p,local_920._8_8_ + 1);
    }
    if ((pointer *)local_748._0_8_ != local_738) {
      operator_delete((void *)local_748._0_8_,(ulong)(local_738[0] + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_960._M_p != &local_950) {
      operator_delete(local_960._M_p,local_950._M_allocated_capacity + 1);
    }
    if ((pointer *)local_728._0_8_ != local_718) {
      operator_delete((void *)local_728._0_8_,(ulong)(local_718[0] + 1));
    }
    if (local_9b8._M_p != local_9b0 + 8) {
      operator_delete(local_9b8._M_p,local_9b0._8_8_ + 1);
    }
    if ((pointer *)local_708._0_8_ != local_6f8) {
      operator_delete((void *)local_708._0_8_,(ulong)(local_6f8[0] + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f58._M_p != &local_f48) {
      operator_delete(local_f58._M_p,local_f48._M_allocated_capacity + 1);
    }
    if ((pointer *)local_988._0_8_ != local_978) {
      operator_delete((void *)local_988._0_8_,(ulong)(local_978[0] + 1));
    }
    if (local_5a8._M_p != local_598) {
      operator_delete(local_5a8._M_p,local_598._0_8_ + 1);
    }
    if (local_9e0 != local_9d0) {
      operator_delete(local_9e0,(long)local_9d0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_p != &local_320) {
      operator_delete(local_330._M_p,local_320._M_allocated_capacity + 1);
    }
    if (local_6d8 != (undefined1  [8])&local_6c8) {
      operator_delete((void *)local_6d8,(ulong)(local_6c8 + 1));
    }
    lVar17 = 0;
    do {
      pSVar9 = (SpecConstantTest *)operator_new(0x138);
      anon_unknown_0::SpecConstantTest::SpecConstantTest
                (pSVar9,local_1038,VVar1,(CaseDefinition *)(local_f28 + lVar17));
      tcu::TestNode::addChild(pTVar8,(TestNode *)pSVar9);
      lVar17 = lVar17 + 0xc0;
    } while (lVar17 != 0x480);
    lVar17 = 0x3c0;
    do {
      anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)(local_f28 + lVar17));
      lVar17 = lVar17 + -0xc0;
    } while (lVar17 != -0xc0);
    tcu::TestNode::addChild(local_6e0,pTVar8);
    local_1030 = *(VkShaderStageFlagBits *)(local_fe8 + 2);
    local_fe0 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_fe0,local_1038,"composite",
               "specialization constants usage in composite types");
    pTVar8 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar8,local_1038,"vector","");
    lVar17 = 0;
    do {
      pSVar9 = (SpecConstantTest *)operator_new(0x138);
      anon_unknown_0::makeMatrixVectorCompositeCaseDefinition
                ((CaseDefinition *)local_f28,*(DataType *)((long)&DAT_00b10970 + lVar17));
      anon_unknown_0::SpecConstantTest::SpecConstantTest
                (pSVar9,local_1038,local_1030,(CaseDefinition *)local_f28);
      tcu::TestNode::addChild(pTVar8,(TestNode *)pSVar9);
      anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)local_f28);
      lVar17 = lVar17 + 4;
    } while (lVar17 != 0x3c);
    tcu::TestNode::addChild(local_fe0,pTVar8);
    pTVar8 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar8,local_1038,"matrix","");
    lVar17 = 0;
    do {
      pSVar9 = (SpecConstantTest *)operator_new(0x138);
      anon_unknown_0::makeMatrixVectorCompositeCaseDefinition
                ((CaseDefinition *)local_f28,*(DataType *)((long)&DAT_00b109b0 + lVar17));
      anon_unknown_0::SpecConstantTest::SpecConstantTest
                (pSVar9,local_1038,local_1030,(CaseDefinition *)local_f28);
      tcu::TestNode::addChild(pTVar8,(TestNode *)pSVar9);
      anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)local_f28);
      lVar17 = lVar17 + 4;
    } while (lVar17 != 0x48);
    tcu::TestNode::addChild(local_fe0,pTVar8);
    pTVar8 = (TestNode *)operator_new(0x70);
    __return_storage_ptr__ = (CaseDefinition *)0xaf21f7;
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar8,local_1038,"array","");
    lVar17 = 0;
    do {
      iVar14 = (int)__return_storage_ptr__;
      pSVar9 = (SpecConstantTest *)operator_new(0x138);
      __return_storage_ptr__ = (CaseDefinition *)local_f28;
      anon_unknown_0::makeArrayCompositeCaseDefinition
                (__return_storage_ptr__,*(DataType *)((long)&DAT_00b10a00 + lVar17),0,iVar14);
      anon_unknown_0::SpecConstantTest::SpecConstantTest
                (pSVar9,local_1038,local_1030,__return_storage_ptr__);
      tcu::TestNode::addChild(pTVar8,(TestNode *)pSVar9);
      anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)local_f28);
      lVar17 = lVar17 + 4;
    } while (lVar17 != 0x98);
    lVar17 = 0;
    do {
      iVar14 = (int)__return_storage_ptr__;
      pSVar9 = (SpecConstantTest *)operator_new(0x138);
      __return_storage_ptr__ = (CaseDefinition *)local_f28;
      anon_unknown_0::makeArrayCompositeCaseDefinition
                (__return_storage_ptr__,*(DataType *)((long)&DAT_00b10a00 + lVar17),2,iVar14);
      anon_unknown_0::SpecConstantTest::SpecConstantTest
                (pSVar9,local_1038,local_1030,__return_storage_ptr__);
      tcu::TestNode::addChild(pTVar8,(TestNode *)pSVar9);
      anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)local_f28);
      lVar17 = lVar17 + 4;
    } while (lVar17 != 0x98);
    local_f28._0_8_ = local_f28 + 0x10;
    local_f28._8_8_ = 6;
    local_f28._16_7_ = 0x746375727473;
    local_7c0 = (undefined1  [8])&local_7b0;
    local_5b0 = (undefined1  [8])&DAT_00000030;
    local_7c0 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_7c0,(ulong)local_5b0);
    local_7b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5b0;
    *(undefined8 *)((long)local_7c0 + 0x20) = 0x202020746e692074;
    *(undefined8 *)((long)local_7c0 + 0x28) = 0x3b31203d20306373;
    *(undefined8 *)((long)local_7c0 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_7c0 + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_7c0 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_7c0 + 4),"ut(c",4);
    *(undefined4 *)((long)local_7c0 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_7c0 + 0xc),"ant_",4);
    local_7b8._M_p = (pointer)local_5b0;
    *(char *)((long)local_7c0 + (long)local_5b0) = '\0';
    local_338._0_4_ = 1;
    local_330._M_p = (pointer)&local_320;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_330,local_7c0,(char *)((long)local_5b0 + (long)local_7c0));
    local_310 = 4;
    local_308.m_data = 3;
    local_8a0 = (undefined1  [8])&local_890;
    local_f60 = (undefined1  [8])0x32;
    local_8a0 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_8a0,(ulong)local_f60);
    local_890 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f60;
    *(undefined8 *)((long)local_8a0 + 0x20) = 0x2074616f6c662074;
    *(undefined8 *)((long)local_8a0 + 0x28) = 0x2e31203d20316373;
    *(undefined8 *)((long)local_8a0 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_8a0 + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_8a0 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_8a0 + 4),"ut(c",4);
    *(undefined4 *)((long)local_8a0 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_8a0 + 0xc),"ant_",4);
    *(undefined2 *)((long)local_8a0 + 0x30) = 0x3b30;
    local_898._M_p = (pointer)local_f60;
    *(char *)((long)local_8a0 + (long)local_f60) = '\0';
    local_5b0._0_4_ = 2;
    local_5a8._M_p = local_598;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5a8,local_8a0,(char *)((long)local_f60 + (long)local_8a0));
    local_588 = 4;
    local_580.m_data = 0x40a00000;
    local_7f8 = (undefined1  [8])&local_7e8;
    local_9c0 = (undefined1  [8])&DAT_00000033;
    local_7f8 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_7f8,(ulong)local_9c0);
    local_7e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_9c0;
    *(undefined8 *)((long)local_7f8 + 0x20) = 0x20206c6f6f622074;
    *(undefined8 *)((long)local_7f8 + 0x28) = 0x7274203d20326373;
    *(undefined8 *)((long)local_7f8 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_7f8 + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_7f8 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_7f8 + 4),"ut(c",4);
    *(undefined4 *)((long)local_7f8 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_7f8 + 0xc),"ant_",4);
    builtin_strncpy((char *)((long)local_7f8 + 0x2f),"rue;",4);
    local_7f0._M_p = (pointer)local_9c0;
    *(char *)((long)local_7f8 + (long)local_9c0) = '\0';
    local_f60._0_4_ = 3;
    local_f58._M_p = (pointer)&local_f48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f58,local_7f8,(char *)((long)local_9c0 + (long)local_7f8));
    local_f38 = 4;
    local_f30.m_data = 0;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              ((vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
                *)(local_f28 + 0x20),(SpecConstant *)local_338,(SpecConstant *)local_5b0,
               (SpecConstant *)local_f60);
    local_f28._56_8_ = 4;
    local_ee8._M_p = (pointer)&local_ed8;
    local_9c0 = (undefined1  [8])0x10;
    local_ee8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)&local_ee8,(ulong)local_9c0);
    local_ed8._M_allocated_capacity._0_5_ = local_9c0._0_5_;
    local_ed8._M_allocated_capacity._5_3_ = local_9c0._5_3_;
    builtin_strncpy(local_ee8._M_p,"    int result;\n",0x10);
    local_ee0 = (pointer)local_9c0;
    local_ee8._M_p[(long)local_9c0] = '\0';
    local_ec8._M_p = (pointer)&local_eb8;
    local_9c0 = (undefined1  [8])0x8c;
    local_ec8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)&local_ec8,(ulong)local_9c0);
    auVar3 = local_9c0;
    local_eb8._M_allocated_capacity = (size_type)local_9c0;
    memcpy(local_ec8._M_p,
           "struct Data {\n    int   x;\n    float y;\n    bool  z;\n};\n\nData a0[3] = Data[3](Data(sc0, 2.0, true), Data(1, sc1, true), Data(1, 2.0, sc2));\n"
           ,0x8c);
    local_ec0 = (pointer)auVar3;
    local_ec8._M_p[(long)auVar3] = '\0';
    local_ea8._M_p = (pointer)local_1008;
    local_9c0 = (undefined1  [8])0x90;
    local_ea8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)local_1000,(ulong)local_9c0);
    auVar3 = local_9c0;
    local_e98._M_allocated_capacity = (size_type)local_9c0;
    memcpy(local_ea8._M_p,
           "    int sum_a0 = 0;\n\n    for (int i = 0; i < 3; ++i)\n        sum_a0 += int(a0[i].x) + int(a0[i].y) + int(a0[i].z);\n\n    sb_out.result = sum_a0;\n"
           ,0x90);
    local_ea0 = (pointer)auVar3;
    local_ea8._M_p[(long)auVar3] = '\0';
    local_9c0 = (undefined1  [8])0x4;
    local_9b8._M_p = (pointer)0x10;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (local_ff0,(OffsetValue *)local_9c0);
    local_e70 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f58._M_p != &local_f48) {
      operator_delete(local_f58._M_p,local_f48._M_allocated_capacity + 1);
    }
    if (local_7f8 != (undefined1  [8])&local_7e8) {
      operator_delete((void *)local_7f8,(ulong)(local_7e8->_M_local_buf + 1));
    }
    if (local_5a8._M_p != local_598) {
      operator_delete(local_5a8._M_p,local_598._0_8_ + 1);
    }
    if (local_8a0 != (undefined1  [8])&local_890) {
      operator_delete((void *)local_8a0,(ulong)(local_890->_M_local_buf + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_p != &local_320) {
      operator_delete(local_330._M_p,local_320._M_allocated_capacity + 1);
    }
    if (local_7c0 != (undefined1  [8])&local_7b0) {
      operator_delete((void *)local_7c0,(ulong)(local_7b0->_M_local_buf + 1));
    }
    pSVar9 = (SpecConstantTest *)operator_new(0x138);
    anon_unknown_0::SpecConstantTest::SpecConstantTest
              (pSVar9,local_1038,local_1030,(CaseDefinition *)local_f28);
    tcu::TestNode::addChild(pTVar8,(TestNode *)pSVar9);
    anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)local_f28);
    tcu::TestNode::addChild(local_fe0,pTVar8);
    local_1020 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_1020,local_1038,"struct","");
    lVar17 = 0;
    do {
      local_1028 = (SpecConstantTest *)operator_new(0x138);
      DVar7 = *(DataType *)((long)&DAT_00b10a00 + lVar17);
      local_1018 = lVar17;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f28);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_f28,"struct Data {\n",0xe)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_f28,"    int   i;\n",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_f28,"    float f;\n",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_f28,"    bool  b;\n",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_f28,"    ",4);
      pcVar10 = glu::getDataTypeName(DVar7);
      if (pcVar10 == (char *)0x0) {
        std::ios::clear((int)&local_1038 + (int)*(undefined8 *)(local_f28._0_8_ + -0x18) + 0x110);
      }
      else {
        sVar11 = strlen(pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_f28,pcVar10,sVar11);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_f28," sc;\n",5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_f28,"    uint  ui;\n",0xe)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_f28,"};\n",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_f28,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_f28,"Data s0 = Data(3, 2.0, true, ",0x1d);
      pcVar10 = glu::getDataTypeName(DVar7);
      if (pcVar10 == (char *)0x0) {
        std::ios::clear((int)&local_1038 + (int)*(undefined8 *)(local_f28._0_8_ + -0x18) + 0x110);
      }
      else {
        sVar11 = strlen(pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_f28,pcVar10,sVar11);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_f28,"(sc0), 8u);\n",0xc);
      specConstId = glu::getDataTypeScalarType(DVar7);
      type = TYPE_DOUBLE_MAT3X4;
      if (specConstId == TYPE_BOOL) {
        type = TYPE_INVALID;
      }
      DVar6 = specConstId;
      if (specConstId == TYPE_BOOL) {
        DVar6 = TYPE_INT;
      }
      pcVar10 = glu::getDataTypeName(DVar6);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_9c0,pcVar10,(allocator<char> *)local_338);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_338);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338,"    ",4);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_338,(char *)local_9c0,(long)local_9b8._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," sum_s0 = ",10);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,(char *)local_9c0,(long)local_9b8._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"(0);\n",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"    sum_s0 += ",0xe);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,(char *)local_9c0,(long)local_9b8._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"(s0.i);\n",8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"    sum_s0 += ",0xe);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,(char *)local_9c0,(long)local_9b8._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"(s0.f);\n",8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"    sum_s0 += ",0xe);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,(char *)local_9c0,(long)local_9b8._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"(s0.b);\n",8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"    sum_s0 += ",0xe);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,(char *)local_9c0,(long)local_9b8._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"(s0.sc",6);
      pcVar10 = "[0][0]";
      if ((8 < DVar7 - TYPE_DOUBLE_MAT2 && 8 < DVar7 - TYPE_FLOAT_MAT2) &&
         (((TYPE_UINT_VEC4 < DVar7 ||
           (pcVar10 = "[0]", (0x77003801cU >> ((ulong)DVar7 & 0x3f) & 1) == 0)) &&
          (pcVar10 = "", DVar7 - TYPE_BOOL_VEC2 < 3)))) {
        pcVar10 = "[0]";
      }
      local_f60 = (undefined1  [8])&local_f50;
      sVar11 = strlen(pcVar10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f60,pcVar10,pcVar10 + sVar11);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,(char *)local_f60,(long)local_f58._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,");\n",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"    sum_s0 += ",0xe);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,(char *)local_9c0,(long)local_9b8._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"(s0.ui);\n",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,"    sb_out.result = sum_s0;\n",0x1c);
      if (local_f60 != (undefined1  [8])&local_f50) {
        operator_delete((void *)local_f60,(ulong)(local_f50 + 1));
      }
      pcVar10 = glu::getDataTypeName(DVar7);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_968,pcVar10,(allocator<char> *)local_f60);
      local_5b0 = (undefined1  [8])local_5a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_5b0,local_968,local_960._M_p + (long)local_968);
      local_930 = (undefined1  [8])local_920;
      local_920[2] = '0';
      local_920._0_2_ = 0x6373;
      local_928._M_p = (pointer)0x3;
      local_920[3] = '\0';
      anon_unknown_0::composite_case_internal::makeSpecConstant
                ((SpecConstant *)local_f60,(string *)local_930,specConstId,type,(int)o4);
      makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
                ((vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
                  *)(local_598 + 8),(SpecConstant *)local_f60);
      DVar6 = glu::getDataTypeScalarType(DVar6);
      if (DVar6 < TYPE_BOOL_VEC2) {
        local_578 = 4;
        if ((0x888000002U >> ((ulong)DVar6 & 0x3f) & 1) == 0) {
          if ((ulong)DVar6 != 0xe) goto LAB_004bf78e;
          local_578 = 8;
        }
      }
      else {
LAB_004bf78e:
        local_578 = 0;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_868,
                     "    ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_9c0);
      plVar13 = (long *)std::__cxx11::string::append((char *)local_868);
      local_570._M_p = (pointer)local_560;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar13 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar13 == paVar15) {
        local_560[0]._0_8_ = paVar15->_M_allocated_capacity;
        local_560[0]._8_8_ = plVar13[3];
      }
      else {
        local_560[0]._0_8_ = paVar15->_M_allocated_capacity;
        local_570._M_p = (pointer)*plVar13;
      }
      local_568 = plVar13[1];
      *plVar13 = (long)paVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringbuf::str();
      DVar7 = glu::getDataTypeScalarType(DVar7);
      if (DVar7 < TYPE_BOOL_VEC2) {
        local_6d8._0_4_ = 4;
        if ((0x888000002U >> ((ulong)DVar7 & 0x3f) & 1) == 0) {
          if ((ulong)DVar7 != 0xe) goto LAB_004bf795;
          local_6d8._0_4_ = 8;
        }
      }
      else {
LAB_004bf795:
        local_6d8._0_4_ = 0;
      }
      uVar16 = type + TYPE_DOUBLE;
      if (specConstId == TYPE_FLOAT) {
        local_6d0._M_p = (pointer)(ulong)(uint)(float)uVar16;
      }
      else if (specConstId == TYPE_DOUBLE) {
        local_6d0._M_p = (pointer)(double)uVar16;
      }
      else {
        local_6d0._M_p = (pointer)(ulong)uVar16;
      }
      local_6d8._4_4_ = 0;
      makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
                (local_ff8,(OffsetValue *)local_6d8);
      local_4f8 = (uint)(specConstId == TYPE_DOUBLE) << 2;
      if (local_868 != (undefined1  [8])local_858) {
        operator_delete((void *)local_868,local_858._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f58._M_p != &local_f48) {
        operator_delete(local_f58._M_p,local_f48._M_allocated_capacity + 1);
      }
      if (local_930 != (undefined1  [8])local_920) {
        operator_delete((void *)local_930,
                        CONCAT44(local_920._4_4_,
                                 CONCAT13(local_920[3],CONCAT12(local_920[2],local_920._0_2_))) + 1)
        ;
      }
      if (local_968 != (undefined1  [8])&local_958) {
        operator_delete((void *)local_968,local_958 + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_338);
      std::ios_base::~ios_base(local_2c8);
      if (local_9c0 != (undefined1  [8])local_9b0) {
        operator_delete((void *)local_9c0,(ulong)(local_9b0._0_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f28);
      std::ios_base::~ios_base((ios_base *)local_eb8._M_local_buf);
      pSVar9 = local_1028;
      anon_unknown_0::SpecConstantTest::SpecConstantTest
                (local_1028,local_1038,local_1030,(CaseDefinition *)local_5b0);
      tcu::TestNode::addChild(local_1020,(TestNode *)pSVar9);
      anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)local_5b0);
      lVar17 = local_1018 + 4;
    } while (lVar17 != 0x98);
    local_f28._0_8_ = local_f28 + 0x10;
    local_f28._8_8_ = 5;
    local_f28._16_6_ = 0x7961727261;
    local_8d8 = (undefined1  [8])&local_8c8;
    local_5b0 = (undefined1  [8])0x32;
    local_8d8 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_8d8,(ulong)local_5b0);
    local_8c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5b0;
    *(undefined8 *)((long)local_8d8 + 0x20) = 0x2074616f6c662074;
    *(undefined8 *)((long)local_8d8 + 0x28) = 0x2e31203d20306373;
    *(undefined8 *)((long)local_8d8 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_8d8 + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_8d8 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_8d8 + 4),"ut(c",4);
    *(undefined4 *)((long)local_8d8 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_8d8 + 0xc),"ant_",4);
    *(undefined2 *)((long)local_8d8 + 0x30) = 0x3b30;
    local_8d0._M_p = (pointer)local_5b0;
    *(char *)((long)local_8d8 + (long)local_5b0) = '\0';
    local_338._0_4_ = 1;
    local_330._M_p = (pointer)&local_320;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_330,local_8d8,(char *)((long)local_5b0 + (long)local_8d8));
    local_310 = 4;
    local_308.m_data = 0x41f80000;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              ((vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
                *)(local_f28 + 0x20),(SpecConstant *)local_338);
    local_f28._56_8_ = 4;
    local_ee8._M_p = (pointer)&local_ed8;
    local_5b0 = (undefined1  [8])0x12;
    local_ee8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)&local_ee8,(ulong)local_5b0);
    local_ed8._M_allocated_capacity._0_5_ = local_5b0._0_5_;
    local_ed8._M_allocated_capacity._5_3_ = local_5b0._5_3_;
    builtin_strncpy(local_ee8._M_p,"    float result;\n",0x12);
    local_ee0 = (pointer)local_5b0;
    local_ee8._M_p[(long)local_5b0] = '\0';
    local_ec8._M_p = (pointer)&local_eb8;
    local_5b0 = (undefined1  [8])0x7e;
    local_ec8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)&local_ec8,(ulong)local_5b0);
    auVar3 = local_5b0;
    local_eb8._M_allocated_capacity = (size_type)local_5b0;
    memcpy(local_ec8._M_p,
           "struct Data {\n    int  i;\n    vec3 sc[3];\n    bool b;\n};\n\nData s0 = Data(1, vec3[3](vec3(2.0), vec3(sc0), vec3(4.0)), false);\n"
           ,0x7e);
    local_ec0 = (pointer)auVar3;
    local_ec8._M_p[(long)auVar3] = '\0';
    local_ea8._M_p = (pointer)local_1008;
    local_5b0 = (undefined1  [8])0xd0;
    __dest = (pointer)std::__cxx11::string::_M_create((ulong *)local_1000,(ulong)local_5b0);
    auVar3 = local_5b0;
    local_e98._M_allocated_capacity = (size_type)local_5b0;
    local_ea8._M_p = __dest;
    memcpy(__dest,
           "    float sum_s0 = 0;\n\n    sum_s0 += float(s0.i);\n    sum_s0 += float(s0.sc[0][0]);\n    sum_s0 += float(s0.sc[1][0]);\n    sum_s0 += float(s0.sc[2][0]);\n    sum_s0 += float(s0.b);\n\n    sb_out.result = sum_s0;\n"
           ,0xd0);
    local_ea0 = (pointer)auVar3;
    __dest[(long)auVar3] = '\0';
    local_5b0 = (undefined1  [8])0x4;
    local_5a8._M_p = (pointer)0x42180000;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (local_ff0,(OffsetValue *)local_5b0);
    local_e70 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_p != &local_320) {
      operator_delete(local_330._M_p,local_320._M_allocated_capacity + 1);
    }
    if (local_8d8 != (undefined1  [8])&local_8c8) {
      operator_delete((void *)local_8d8,(ulong)(local_8c8->_M_local_buf + 1));
    }
    pSVar9 = (SpecConstantTest *)operator_new(0x138);
    anon_unknown_0::SpecConstantTest::SpecConstantTest
              (pSVar9,local_1038,local_1030,(CaseDefinition *)local_f28);
    tcu::TestNode::addChild(local_1020,(TestNode *)pSVar9);
    anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)local_f28);
    local_f28._0_8_ = local_f28 + 0x10;
    local_f28._8_8_ = 6;
    local_f28._16_7_ = 0x746375727473;
    local_830 = (undefined1  [8])&local_820;
    local_5b0 = (undefined1  [8])0x2e;
    local_830 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_830,(ulong)local_5b0);
    local_820 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5b0;
    builtin_strncpy((char *)((long)local_830 + 0x1e),"nst int ",8);
    builtin_strncpy((char *)((long)local_830 + 0x26),"sc0 = 1;",8);
    *(undefined8 *)((long)local_830 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_830 + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_830 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_830 + 4),"ut(c",4);
    *(undefined4 *)((long)local_830 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_830 + 0xc),"ant_",4);
    local_828._M_p = (pointer)local_5b0;
    *(char *)((long)local_830 + (long)local_5b0) = '\0';
    local_338._0_4_ = 1;
    local_330._M_p = (pointer)&local_320;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_330,local_830,(char *)((long)local_5b0 + (long)local_830));
    local_310 = 4;
    local_308.m_data = 0xb;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              ((vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
                *)(local_f28 + 0x20),(SpecConstant *)local_338);
    local_f28._56_8_ = 4;
    local_ee8._M_p = (pointer)&local_ed8;
    local_5b0 = (undefined1  [8])0x10;
    local_ee8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)&local_ee8,(ulong)local_5b0);
    local_ed8._M_allocated_capacity._0_5_ = local_5b0._0_5_;
    local_ed8._M_allocated_capacity._5_3_ = local_5b0._5_3_;
    *(undefined8 *)local_ee8._M_p = 0x20746e6920202020;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_ee8._M_p + 8) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_ee8._M_p + 9) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_ee8._M_p + 10) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_ee8._M_p + 0xb) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_ee8._M_p + 0xc) = 'l';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_ee8._M_p + 0xd) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_ee8._M_p + 0xe) = ';';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_ee8._M_p + 0xf) = '\n';
    local_ee0 = (pointer)local_5b0;
    local_ee8._M_p[(long)local_5b0] = '\0';
    local_ec8._M_p = (pointer)&local_eb8;
    local_5b0 = (undefined1  [8])0xb0;
    local_ec8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)&local_ec8,(ulong)local_5b0);
    auVar3 = local_5b0;
    local_eb8._M_allocated_capacity = (size_type)local_5b0;
    memcpy(local_ec8._M_p,
           "struct Nested {\n    vec2  v;\n    int   sc;\n    float f;\n};\n\nstruct Data {\n    uint   ui;\n    Nested s;\n    bool   b;\n};\n\nData s0 = Data(1u, Nested(vec2(2.0), sc0, 4.0), true);\n"
           ,0xb0);
    local_ec0 = (pointer)auVar3;
    local_ec8._M_p[(long)auVar3] = '\0';
    local_ea8._M_p = (pointer)local_1008;
    local_5b0 = (undefined1  [8])0xba;
    local_ea8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)local_1000,(ulong)local_5b0);
    auVar3 = local_5b0;
    local_e98._M_allocated_capacity = (size_type)local_5b0;
    memcpy(local_ea8._M_p,
           "    int sum_s0 = 0;\n\n    sum_s0 += int(s0.ui);\n    sum_s0 += int(s0.s.v[0]);\n    sum_s0 += int(s0.s.sc);\n    sum_s0 += int(s0.s.f);\n    sum_s0 += int(s0.b);\n\n    sb_out.result = sum_s0;\n"
           ,0xba);
    local_ea0 = (pointer)auVar3;
    local_ea8._M_p[(long)auVar3] = '\0';
    local_5b0 = (undefined1  [8])0x4;
    local_5a8._M_p = (pointer)0x13;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (local_ff0,(OffsetValue *)local_5b0);
    local_e70 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_p != &local_320) {
      operator_delete(local_330._M_p,local_320._M_allocated_capacity + 1);
    }
    if (local_830 != (undefined1  [8])&local_820) {
      operator_delete((void *)local_830,(ulong)(local_820->_M_local_buf + 1));
    }
    pSVar9 = (SpecConstantTest *)operator_new(0x138);
    anon_unknown_0::SpecConstantTest::SpecConstantTest
              (pSVar9,local_1038,local_1030,(CaseDefinition *)local_f28);
    tcu::TestNode::addChild(local_1020,(TestNode *)pSVar9);
    anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)local_f28);
    pTVar8 = local_fe0;
    tcu::TestNode::addChild(local_fe0,local_1020);
    tcu::TestNode::addChild(local_6e0,pTVar8);
    if (*(int *)(local_fe8 + 2) == 0x20) {
      pTVar8 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,local_1038,"local_size","work group size specialization");
      local_6d8 = (undefined1  [8])&local_6c8;
      local_f28._0_8_ = (pointer)0x2d;
      local_6d8 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_6d8,(ulong)local_f28);
      local_6c8 = (pointer)local_f28._0_8_;
      builtin_strncpy((char *)((long)local_6d8 + 0x1d),"uint  ch",8);
      builtin_strncpy((char *)((long)local_6d8 + 0x25),"ecksum;\n",8);
      *(undefined8 *)((long)local_6d8 + 0x10) = 0x3b657a695370756f;
      *(undefined8 *)((long)local_6d8 + 0x18) = 0x6e6975202020200a;
      *(undefined8 *)local_6d8 = 0x6365767520202020;
      *(undefined8 *)((long)local_6d8 + 8) = 0x72476b726f772033;
      local_6d0._M_p = (pointer)local_f28._0_8_;
      *(char *)((long)local_6d8 + local_f28._0_8_) = '\0';
      local_9e0 = local_9d0;
      local_f28._0_8_ = (pointer *)0x13;
      local_9e0 = (pointer **)std::__cxx11::string::_M_create((ulong *)&local_9e0,(ulong)local_f28);
      local_9d0[0] = (pointer *)local_f28._0_8_;
      *local_9e0 = (pointer *)0x7520646572616873;
      local_9e0[1] = (pointer *)0x6e756f6320746e69;
      builtin_strncpy((char *)((long)local_9e0 + 0xf),"nt;\n",4);
      local_9d8 = (pointer *)local_f28._0_8_;
      *(char *)((long)local_9e0 + local_f28._0_8_) = '\0';
      local_988._0_8_ = local_978;
      local_f28._0_8_ = (pointer)0xcf;
      __dest_00 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_988,(ulong)local_f28);
      uVar2 = local_f28._0_8_;
      local_978[0] = (pointer)local_f28._0_8_;
      local_988._0_8_ = __dest_00;
      memcpy(__dest_00,
             "    count = 0u;\n\n    groupMemoryBarrier();\n    barrier();\n\n    atomicAdd(count, 1u);\n\n    groupMemoryBarrier();\n    barrier();\n\n    sb_out.workGroupSize = gl_WorkGroupSize;\n    sb_out.checksum      = count;\n"
             ,0xcf);
      local_988.value.m_data = uVar2;
      *(char *)((long)__dest_00 + uVar2) = '\0';
      local_f28._0_8_ = local_f28 + 0x10;
      local_f28._16_2_ = 0x78;
      local_f28._8_8_ = 1;
      local_708._0_8_ = local_6f8;
      local_5b0 = (undefined1  [8])0x23;
      local_708._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_708,(ulong)local_5b0);
      local_6f8[0] = (pointer)local_5b0;
      *(undefined8 *)(local_708._0_8_ + 0x10) = 0x3d2064695f785f65;
      *(undefined8 *)(local_708._0_8_ + 0x18) = 0x20297d44497b2420;
      *(undefined4 *)local_708._0_8_ = 0x6f79616c;
      builtin_strncpy((char *)(local_708._0_8_ + 4),"ut(l",4);
      *(undefined4 *)(local_708._0_8_ + 8) = 0x6c61636f;
      builtin_strncpy((char *)(local_708._0_8_ + 0xc),"_siz",4);
      builtin_strncpy((char *)(local_708._0_8_ + 0x1f)," in;",4);
      local_708.value.m_data = (deUint64)local_5b0;
      *(char *)(local_708._0_8_ + (long)local_5b0) = '\0';
      local_338._0_4_ = 1;
      local_330._M_p = (pointer)&local_320;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_330,local_708._0_8_,(pointer)((long)local_5b0 + local_708._0_8_));
      local_310 = 4;
      local_308.m_data = 7;
      makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
                ((vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
                  *)(local_f28 + 0x20),(SpecConstant *)local_338);
      local_f28._56_8_ = 0x10;
      local_ee8._M_p = (pointer)&local_ed8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_ee8,local_6d8,local_6d0._M_p + (long)local_6d8);
      local_ec8._M_p = (pointer)&local_eb8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_ec8,local_9e0,(char *)((long)local_9d8 + (long)local_9e0));
      local_ea8._M_p = (pointer)local_1008;
      std::__cxx11::string::_M_construct<char*>
                (local_1000,local_988._0_8_,(char *)(local_988._0_8_ + local_988.value.m_data));
      local_3e0.size = 4;
      local_3e0.offset = 0;
      local_3e0.value.m_data = 7;
      local_3f0.size = 4;
      local_3f0.offset = 4;
      local_3f0.value.m_data = 1;
      local_400.size = 4;
      local_400.offset = 8;
      local_400.value.m_data = 1;
      local_410.size = 4;
      local_410.offset = 0xc;
      local_410.value.m_data = 7;
      makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
                (local_ff0,&local_3e0,&local_3f0,&local_400,&local_410);
      local_e70 = 0;
      local_e68 = local_fc0;
      local_e58 = 0x79;
      local_e60 = 1;
      local_728._0_8_ = local_718;
      local_f60 = (undefined1  [8])0x23;
      local_728._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_728,(ulong)local_f60);
      local_718[0] = (pointer)local_f60;
      *(undefined8 *)(local_728._0_8_ + 0x10) = 0x3d2064695f795f65;
      *(undefined8 *)(local_728._0_8_ + 0x18) = 0x20297d44497b2420;
      *(undefined4 *)local_728._0_8_ = 0x6f79616c;
      builtin_strncpy((char *)(local_728._0_8_ + 4),"ut(l",4);
      *(undefined4 *)(local_728._0_8_ + 8) = 0x6c61636f;
      builtin_strncpy((char *)(local_728._0_8_ + 0xc),"_siz",4);
      builtin_strncpy((char *)(local_728._0_8_ + 0x1f)," in;",4);
      local_728.value.m_data = (deUint64)local_f60;
      *(char *)(local_728._0_8_ + (long)local_f60) = '\0';
      local_5b0._0_4_ = 1;
      local_5a8._M_p = local_598;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_5a8,local_728._0_8_,(pointer)((long)local_f60 + local_728._0_8_));
      local_588 = 4;
      local_580.m_data = 5;
      makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
                (local_6e8,(SpecConstant *)local_5b0);
      local_e30 = 0x10;
      local_e28 = local_fd0;
      std::__cxx11::string::_M_construct<char*>
                (local_fd8,local_6d8,local_6d0._M_p + (long)local_6d8);
      local_e08 = local_fc8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e08,local_9e0,(char *)((long)local_9d8 + (long)local_9e0));
      local_de8 = local_fb0;
      std::__cxx11::string::_M_construct<char*>
                (local_fb8,local_988._0_8_,(char *)(local_988._0_8_ + local_988.value.m_data));
      local_420.size = 4;
      local_420.offset = 0;
      local_420.value.m_data = 1;
      local_430.size = 4;
      local_430.offset = 4;
      local_430.value.m_data = 5;
      local_440.size = 4;
      local_440.offset = 8;
      local_440.value.m_data = 1;
      local_450.size = 4;
      local_450.offset = 0xc;
      local_450.value.m_data = 5;
      makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
                (local_f98,&local_420,&local_430,&local_440,&local_450);
      local_db0 = 0;
      local_da8 = local_f78;
      local_d98[0] = CONCAT62(local_d98[0]._2_6_,0x7a);
      local_da0 = 1;
      local_748._0_8_ = local_738;
      local_9c0 = (undefined1  [8])0x23;
      local_748._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_748,(ulong)local_9c0);
      local_738[0] = (pointer)local_9c0;
      *(undefined8 *)(local_748._0_8_ + 0x10) = 0x3d2064695f7a5f65;
      *(undefined8 *)(local_748._0_8_ + 0x18) = 0x20297d44497b2420;
      *(undefined4 *)local_748._0_8_ = 0x6f79616c;
      builtin_strncpy((char *)(local_748._0_8_ + 4),"ut(l",4);
      *(undefined4 *)(local_748._0_8_ + 8) = 0x6c61636f;
      builtin_strncpy((char *)(local_748._0_8_ + 0xc),"_siz",4);
      builtin_strncpy((char *)(local_748._0_8_ + 0x1f)," in;",4);
      local_748.value.m_data = (deUint64)local_9c0;
      *(char *)(local_748._0_8_ + (long)local_9c0) = '\0';
      local_f60._0_4_ = 1;
      local_f58._M_p = (pointer)&local_f48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f58,local_748._0_8_,(pointer)((long)local_9c0 + local_748._0_8_));
      local_f38 = 4;
      local_f30.m_data = 3;
      makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
                (local_630,(SpecConstant *)local_f60);
      local_d70 = 0x10;
      local_d68 = local_f68;
      std::__cxx11::string::_M_construct<char*>
                (local_3b8,local_6d8,local_6d0._M_p + (long)local_6d8);
      local_d48 = local_478;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d48,local_9e0,(char *)((long)local_9d8 + (long)local_9e0));
      local_d28 = local_488;
      std::__cxx11::string::_M_construct<char*>
                (local_480,local_988._0_8_,(char *)(local_988._0_8_ + local_988.value.m_data));
      local_628.size = 4;
      local_628.offset = 0;
      local_628.value.m_data = 1;
      local_348.size = 4;
      local_348.offset = 4;
      local_348.value.m_data = 1;
      local_5c0.size = 4;
      local_5c0.offset = 8;
      local_5c0.value.m_data = 3;
      local_358.size = 4;
      local_358.offset = 0xc;
      local_358.value.m_data = 3;
      makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
                (local_490,&local_628,&local_348,&local_5c0,&local_358);
      local_cf0 = 0;
      local_ce8 = local_f80;
      local_ce0 = (pointer)0x2;
      local_cd8[0] = (pointer)CONCAT53(local_cd8[0]._3_5_,0x7978);
      local_768._0_8_ = local_758;
      local_968 = (undefined1  [8])0x23;
      local_768._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_768,(ulong)local_968);
      local_758[0] = (pointer)local_968;
      *(undefined8 *)(local_768._0_8_ + 0x10) = 0x3d2064695f785f65;
      *(undefined8 *)(local_768._0_8_ + 0x18) = 0x20297d44497b2420;
      *(undefined4 *)local_768._0_8_ = 0x6f79616c;
      builtin_strncpy((char *)(local_768._0_8_ + 4),"ut(l",4);
      *(undefined4 *)(local_768._0_8_ + 8) = 0x6c61636f;
      builtin_strncpy((char *)(local_768._0_8_ + 0xc),"_siz",4);
      builtin_strncpy((char *)(local_768._0_8_ + 0x1f)," in;",4);
      local_768.value.m_data = (deUint64)local_968;
      *(char *)(local_768._0_8_ + (long)local_968) = '\0';
      local_9c0._0_4_ = 1;
      local_9b8._M_p = local_9b0 + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_9b8,local_768._0_8_,(char *)(local_768._0_8_ + (long)local_968));
      local_998 = 4;
      local_990.m_data = 6;
      local_788._0_8_ = local_778;
      local_930 = (undefined1  [8])0x23;
      local_788._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_788,(ulong)local_930);
      local_778[0] = (pointer)local_930;
      *(undefined8 *)(local_788._0_8_ + 0x10) = 0x3d2064695f795f65;
      *(undefined8 *)(local_788._0_8_ + 0x18) = 0x20297d44497b2420;
      *(undefined4 *)local_788._0_8_ = 0x6f79616c;
      builtin_strncpy((char *)(local_788._0_8_ + 4),"ut(l",4);
      *(undefined4 *)(local_788._0_8_ + 8) = 0x6c61636f;
      builtin_strncpy((char *)(local_788._0_8_ + 0xc),"_siz",4);
      builtin_strncpy((char *)(local_788._0_8_ + 0x1f)," in;",4);
      local_788.value.m_data = (deUint64)local_930;
      *(char *)(local_788._0_8_ + (long)local_930) = '\0';
      local_968._0_4_ = 2;
      local_960._M_p = (pointer)&local_950;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_960,local_788._0_8_,(pointer)((long)local_930 + local_788._0_8_));
      local_940 = 4;
      local_938.m_data = 4;
      makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
                (local_638,(SpecConstant *)local_9c0,(SpecConstant *)local_968);
      local_cb0 = 0x10;
      local_ca8 = local_4e8;
      std::__cxx11::string::_M_construct<char*>
                (local_3c0,local_6d8,local_6d0._M_p + (long)local_6d8);
      local_c88 = local_498;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c88,local_9e0,(char *)((long)local_9d8 + (long)local_9e0));
      local_c68 = local_4a8;
      std::__cxx11::string::_M_construct<char*>
                (local_4a0,local_988._0_8_,(char *)(local_988._0_8_ + local_988.value.m_data));
      local_d8.size = 4;
      local_d8.offset = 0;
      local_d8.value.m_data = 6;
      local_e8.size = 4;
      local_e8.offset = 4;
      local_e8.value.m_data = 4;
      local_f8.size = 4;
      local_f8.offset = 8;
      local_f8.value.m_data = 1;
      local_108.size = 4;
      local_108.offset = 0xc;
      local_108.value.m_data = 0x18;
      makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
                (local_4b0,&local_d8,&local_e8,&local_f8,&local_108);
      local_c30 = 0;
      local_c28 = local_5c8;
      local_c20 = 2;
      local_c18[0] = CONCAT53(local_c18[0]._3_5_,0x7a78);
      local_8f8._0_8_ = local_8e8;
      local_868 = (undefined1  [8])0x23;
      local_8f8._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_8f8,(ulong)local_868);
      local_8e8[0] = (pointer)local_868;
      *(undefined8 *)(local_8f8._0_8_ + 0x10) = 0x3d2064695f785f65;
      *(undefined8 *)(local_8f8._0_8_ + 0x18) = 0x20297d44497b2420;
      *(undefined4 *)local_8f8._0_8_ = 0x6f79616c;
      builtin_strncpy((char *)(local_8f8._0_8_ + 4),"ut(l",4);
      *(undefined4 *)(local_8f8._0_8_ + 8) = 0x6c61636f;
      builtin_strncpy((char *)(local_8f8._0_8_ + 0xc),"_siz",4);
      builtin_strncpy((char *)(local_8f8._0_8_ + 0x1f)," in;",4);
      local_8f8.value.m_data = (deUint64)local_868;
      *(char *)(local_8f8._0_8_ + (long)local_868) = '\0';
      local_930._0_4_ = 1;
      local_928._M_p = local_920 + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_928,local_8f8._0_8_,(pointer)((long)local_868 + local_8f8._0_8_));
      local_908 = 4;
      local_900.m_data = 3;
      local_660 = local_650;
      local_7c0 = (undefined1  [8])0x23;
      local_660 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_660,(ulong)local_7c0);
      local_650[0] = (ulong)local_7c0;
      local_660[2] = 0x3d2064695f7a5f65;
      local_660[3] = 0x20297d44497b2420;
      *(undefined4 *)local_660 = 0x6f79616c;
      builtin_strncpy((char *)((long)local_660 + 4),"ut(l",4);
      *(undefined4 *)(local_660 + 1) = 0x6c61636f;
      builtin_strncpy((char *)((long)local_660 + 0xc),"_siz",4);
      builtin_strncpy((char *)((long)local_660 + 0x1f)," in;",4);
      local_658 = (ulong)local_7c0;
      *(char *)((long)local_660 + (long)local_7c0) = '\0';
      local_868._0_4_ = 2;
      local_860._M_p = local_858 + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_860,local_660,(char *)((long)local_660 + (long)local_7c0));
      local_840 = 4;
      local_838.m_data = 9;
      makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
                (local_640,(SpecConstant *)local_930,(SpecConstant *)local_868);
      local_bf0 = 0x10;
      local_be8 = local_4f0;
      std::__cxx11::string::_M_construct<char*>
                (local_3c8,local_6d8,local_6d0._M_p + (long)local_6d8);
      local_bc8 = local_4b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_bc8,local_9e0,(char *)((long)local_9d8 + (long)local_9e0));
      local_ba8 = local_4c8;
      std::__cxx11::string::_M_construct<char*>
                (local_4c0,local_988._0_8_,(char *)(local_988._0_8_ + local_988.value.m_data));
      local_118.size = 4;
      local_118.offset = 0;
      local_118.value.m_data = 3;
      local_128.size = 4;
      local_128.offset = 4;
      local_128.value.m_data = 1;
      local_138.size = 4;
      local_138.offset = 8;
      local_138.value.m_data = 9;
      local_148.size = 4;
      local_148.offset = 0xc;
      local_148.value.m_data = 0x1b;
      makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
                (local_4d0,&local_118,&local_128,&local_138,&local_148);
      local_b70 = 0;
      local_b68 = local_370;
      local_b60 = 2;
      local_b58[0] = CONCAT53(local_b58[0]._3_5_,0x7a79);
      local_680 = local_670;
      local_8a0 = (undefined1  [8])0x23;
      local_680 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_680,(ulong)local_8a0);
      local_670[0] = (ulong)local_8a0;
      local_680[2] = 0x3d2064695f795f65;
      local_680[3] = 0x20297d44497b2420;
      *(undefined4 *)local_680 = 0x6f79616c;
      builtin_strncpy((char *)((long)local_680 + 4),"ut(l",4);
      *(undefined4 *)(local_680 + 1) = 0x6c61636f;
      builtin_strncpy((char *)((long)local_680 + 0xc),"_siz",4);
      builtin_strncpy((char *)((long)local_680 + 0x1f)," in;",4);
      local_678 = (ulong)local_8a0;
      *(char *)((long)local_680 + (long)local_8a0) = '\0';
      local_7c0._0_4_ = 1;
      local_7b8._M_p = (pointer)&local_7a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7b8,local_680,(char *)((long)local_680 + (long)local_8a0));
      local_798 = 4;
      local_790.m_data = 2;
      local_6a0 = local_690;
      local_7f8 = (undefined1  [8])0x23;
      local_6a0 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_6a0,(ulong)local_7f8);
      local_690[0] = (ulong)local_7f8;
      local_6a0[2] = 0x3d2064695f7a5f65;
      local_6a0[3] = 0x20297d44497b2420;
      *(undefined4 *)local_6a0 = 0x6f79616c;
      builtin_strncpy((char *)((long)local_6a0 + 4),"ut(l",4);
      *(undefined4 *)(local_6a0 + 1) = 0x6c61636f;
      builtin_strncpy((char *)((long)local_6a0 + 0xc),"_siz",4);
      builtin_strncpy((char *)((long)local_6a0 + 0x1f)," in;",4);
      local_698 = (ulong)local_7f8;
      *(char *)((long)local_6a0 + (long)local_7f8) = '\0';
      local_8a0._0_4_ = 2;
      local_898._M_p = (pointer)&local_888;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_898,local_6a0,(char *)((long)local_6a0 + (long)local_7f8));
      local_878 = 4;
      local_870.m_data = 5;
      makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
                (local_4d8,(SpecConstant *)local_7c0,(SpecConstant *)local_8a0);
      local_b30 = 0x10;
      local_b28 = local_380;
      std::__cxx11::string::_M_construct<char*>
                (local_378,local_6d8,local_6d0._M_p + (long)local_6d8);
      local_b08 = local_390;
      std::__cxx11::string::_M_construct<char*>
                (local_388,local_9e0,(char *)((long)local_9d8 + (long)local_9e0));
      local_ae8 = local_3a0;
      std::__cxx11::string::_M_construct<char*>
                (local_398,local_988._0_8_,(char *)(local_988._0_8_ + local_988.value.m_data));
      local_158.size = 4;
      local_158.offset = 0;
      local_158.value.m_data = 1;
      local_168.size = 4;
      local_168.offset = 4;
      local_168.value.m_data = 2;
      local_178.size = 4;
      local_178.offset = 8;
      local_178.value.m_data = 5;
      local_188.size = 4;
      local_188.offset = 0xc;
      local_188.value.m_data = 10;
      makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
                (local_3a8,&local_158,&local_168,&local_178,&local_188);
      local_ab0 = 0;
      local_aa8 = &local_a98;
      local_a96 = 0x7a;
      local_a98 = 0x7978;
      local_aa0 = 3;
      local_a95 = 0;
      local_5f0._0_8_ = local_5e0;
      local_8d8 = (undefined1  [8])0x23;
      local_5f0._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_5f0,(ulong)local_8d8);
      local_5e0[0] = (ulong)local_8d8;
      *(undefined8 *)(local_5f0._0_8_ + 0x10) = 0x3d2064695f785f65;
      *(undefined8 *)(local_5f0._0_8_ + 0x18) = 0x20297d44497b2420;
      *(undefined4 *)local_5f0._0_8_ = 0x6f79616c;
      builtin_strncpy((char *)(local_5f0._0_8_ + 4),"ut(l",4);
      *(undefined4 *)(local_5f0._0_8_ + 8) = 0x6c61636f;
      builtin_strncpy((char *)(local_5f0._0_8_ + 0xc),"_siz",4);
      builtin_strncpy((char *)(local_5f0._0_8_ + 0x1f)," in;",4);
      local_5f0.value.m_data = (deUint64)local_8d8;
      *(char *)(local_5f0._0_8_ + (long)local_8d8) = '\0';
      local_7f8._0_4_ = 1;
      local_7f0._M_p = (pointer)&local_7e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7f0,local_5f0._0_8_,(char *)(local_5f0._0_8_ + (long)local_8d8));
      local_7d0 = 4;
      local_7c8.m_data = 3;
      local_610._0_8_ = local_600;
      local_830 = (undefined1  [8])0x23;
      local_610._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_610,(ulong)local_830);
      local_600[0] = (pointer *)local_830;
      *(undefined8 *)(local_610._0_8_ + 0x10) = 0x3d2064695f795f65;
      *(undefined8 *)(local_610._0_8_ + 0x18) = 0x20297d44497b2420;
      *(undefined4 *)local_610._0_8_ = 0x6f79616c;
      builtin_strncpy((char *)(local_610._0_8_ + 4),"ut(l",4);
      *(undefined4 *)(local_610._0_8_ + 8) = 0x6c61636f;
      builtin_strncpy((char *)(local_610._0_8_ + 0xc),"_siz",4);
      builtin_strncpy((char *)(local_610._0_8_ + 0x1f)," in;",4);
      local_610.value.m_data = (deUint64)local_830;
      *(char *)(local_610._0_8_ + (long)local_830) = '\0';
      local_8d8._0_4_ = 2;
      local_8d0._M_p = (pointer)&local_8c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_8d0,local_610._0_8_,(char *)(local_610._0_8_ + (long)local_830));
      local_8b0 = 4;
      local_8a8.m_data = 5;
      local_470._0_8_ = local_460;
      local_368.size = 0x23;
      local_368.offset = 0;
      local_470._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_470,(ulong)&local_368);
      local_460[0]._0_4_ = local_368.size;
      local_460[0]._4_4_ = local_368.offset;
      *(undefined8 *)(local_470._0_8_ + 0x10) = 0x3d2064695f7a5f65;
      *(undefined8 *)(local_470._0_8_ + 0x18) = 0x20297d44497b2420;
      *(undefined4 *)local_470._0_8_ = 0x6f79616c;
      builtin_strncpy((char *)(local_470._0_8_ + 4),"ut(l",4);
      *(undefined4 *)(local_470._0_8_ + 8) = 0x6c61636f;
      builtin_strncpy((char *)(local_470._0_8_ + 0xc),"_siz",4);
      builtin_strncpy((char *)(local_470._0_8_ + 0x1f)," in;",4);
      local_470.value.m_data._0_4_ = local_368.size;
      local_470.value.m_data._4_4_ = local_368.offset;
      *(char *)(local_470._0_8_ + local_368._0_8_) = '\0';
      local_830._0_4_ = 3;
      local_828._M_p = (pointer)&local_818;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_828,local_470._0_8_,(char *)(local_470._0_8_ + local_368._0_8_));
      local_808 = 4;
      local_800.m_data = 7;
      makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
                (&local_a88,(SpecConstant *)local_7f8,(SpecConstant *)local_8d8,
                 (SpecConstant *)local_830);
      local_a70 = 0x10;
      local_a68[0] = local_a58;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a68,local_6d8,local_6d0._M_p + (long)local_6d8);
      local_a48[0] = local_a38;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a48,local_9e0,(char *)((long)local_9d8 + (long)local_9e0));
      local_a28[0] = local_a18;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a28,local_988._0_8_,
                 (char *)(local_988._0_8_ + local_988.value.m_data));
      local_368.size = 4;
      local_368.offset = 0;
      local_368.value.m_data = 3;
      local_198.size = 4;
      local_198.offset = 4;
      local_198.value.m_data = 5;
      local_1a8.size = 4;
      local_1a8.offset = 8;
      local_1a8.value.m_data = 7;
      local_1b8.size = 4;
      local_1b8.offset = 0xc;
      local_1b8.value.m_data = 0x69;
      makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
                (&local_a08,&local_368,&local_198,&local_1a8,&local_1b8);
      local_9f0 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_828._M_p != &local_818) {
        operator_delete(local_828._M_p,local_818._M_allocated_capacity + 1);
      }
      if ((deUint64 *)local_470._0_8_ != local_460) {
        operator_delete((void *)local_470._0_8_,local_460[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8d0._M_p != &local_8c0) {
        operator_delete(local_8d0._M_p,local_8c0._M_allocated_capacity + 1);
      }
      if ((pointer **)local_610._0_8_ != local_600) {
        operator_delete((void *)local_610._0_8_,(long)local_600[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f0._M_p != &local_7e0) {
        operator_delete(local_7f0._M_p,local_7e0._M_allocated_capacity + 1);
      }
      if ((ulong *)local_5f0._0_8_ != local_5e0) {
        operator_delete((void *)local_5f0._0_8_,local_5e0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_898._M_p != &local_888) {
        operator_delete(local_898._M_p,local_888._M_allocated_capacity + 1);
      }
      if (local_6a0 != local_690) {
        operator_delete(local_6a0,local_690[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b8._M_p != &local_7a8) {
        operator_delete(local_7b8._M_p,local_7a8._M_allocated_capacity + 1);
      }
      if (local_680 != local_670) {
        operator_delete(local_680,local_670[0] + 1);
      }
      if (local_860._M_p != local_858 + 8) {
        operator_delete(local_860._M_p,local_858._8_8_ + 1);
      }
      if (local_660 != local_650) {
        operator_delete(local_660,local_650[0] + 1);
      }
      if (local_928._M_p != local_920 + 8) {
        operator_delete(local_928._M_p,local_920._8_8_ + 1);
      }
      if ((pointer *)local_8f8._0_8_ != local_8e8) {
        operator_delete((void *)local_8f8._0_8_,(ulong)(local_8e8[0] + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_960._M_p != &local_950) {
        operator_delete(local_960._M_p,local_950._M_allocated_capacity + 1);
      }
      if ((pointer *)local_788._0_8_ != local_778) {
        operator_delete((void *)local_788._0_8_,(ulong)(local_778[0] + 1));
      }
      if (local_9b8._M_p != local_9b0 + 8) {
        operator_delete(local_9b8._M_p,local_9b0._8_8_ + 1);
      }
      if ((pointer *)local_768._0_8_ != local_758) {
        operator_delete((void *)local_768._0_8_,(ulong)(local_758[0] + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f58._M_p != &local_f48) {
        operator_delete(local_f58._M_p,local_f48._M_allocated_capacity + 1);
      }
      if ((pointer *)local_748._0_8_ != local_738) {
        operator_delete((void *)local_748._0_8_,(ulong)(local_738[0] + 1));
      }
      if (local_5a8._M_p != local_598) {
        operator_delete(local_5a8._M_p,local_598._0_8_ + 1);
      }
      if ((pointer *)local_728._0_8_ != local_718) {
        operator_delete((void *)local_728._0_8_,(ulong)(local_718[0] + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_p != &local_320) {
        operator_delete(local_330._M_p,local_320._M_allocated_capacity + 1);
      }
      if ((pointer *)local_708._0_8_ != local_6f8) {
        operator_delete((void *)local_708._0_8_,(ulong)(local_6f8[0] + 1));
      }
      lVar17 = 0;
      do {
        pSVar9 = (SpecConstantTest *)operator_new(0x138);
        anon_unknown_0::SpecConstantTest::SpecConstantTest
                  (pSVar9,local_1038,VK_SHADER_STAGE_COMPUTE_BIT,
                   (CaseDefinition *)(local_f28 + lVar17));
        tcu::TestNode::addChild(pTVar8,(TestNode *)pSVar9);
        lVar17 = lVar17 + 0xc0;
      } while (lVar17 != 0x540);
      lVar17 = 0x480;
      do {
        anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)(local_f28 + lVar17));
        lVar17 = lVar17 + -0xc0;
      } while (lVar17 != -0xc0);
      if ((pointer *)local_988._0_8_ != local_978) {
        operator_delete((void *)local_988._0_8_,(ulong)(local_978[0] + 1));
      }
      if (local_9e0 != local_9d0) {
        operator_delete(local_9e0,(long)local_9d0[0] + 1);
      }
      if (local_6d8 != (undefined1  [8])&local_6c8) {
        operator_delete((void *)local_6d8,(ulong)(local_6c8 + 1));
      }
      tcu::TestNode::addChild(local_6e0,pTVar8);
    }
    pTVar8 = local_6e0;
    local_6e0 = (TestNode *)0x0;
    tcu::TestNode::addChild(*local_fe8,pTVar8);
    local_3b0 = local_3b0 + 1;
    if (local_3b0 == 6) {
      return (TestCaseGroup *)local_4e0;
    }
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createSpecConstantTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> allTests (new tcu::TestCaseGroup(testCtx, "spec_constant", "Specialization constants tests"));
	de::MovePtr<tcu::TestCaseGroup> graphicsGroup (new tcu::TestCaseGroup(testCtx, "graphics", ""));

	struct StageDef
	{
		tcu::TestCaseGroup*		parentGroup;
		const char*				name;
		VkShaderStageFlagBits	stage;
	};

	const StageDef stages[] =
	{
		{ graphicsGroup.get(),	"vertex",		VK_SHADER_STAGE_VERTEX_BIT					},
		{ graphicsGroup.get(),	"fragment",		VK_SHADER_STAGE_FRAGMENT_BIT				},
		{ graphicsGroup.get(),	"tess_control",	VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT	},
		{ graphicsGroup.get(),	"tess_eval",	VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT	},
		{ graphicsGroup.get(),	"geometry",		VK_SHADER_STAGE_GEOMETRY_BIT				},
		{ allTests.get(),		"compute",		VK_SHADER_STAGE_COMPUTE_BIT					},
	};

	allTests->addChild(graphicsGroup.release());

	for (int stageNdx = 0; stageNdx < DE_LENGTH_OF_ARRAY(stages); ++stageNdx)
	{
		const StageDef& stage = stages[stageNdx];
		de::MovePtr<tcu::TestCaseGroup> stageGroup (new tcu::TestCaseGroup(testCtx, stage.name, ""));

		stageGroup->addChild(createDefaultValueTests       (testCtx, stage.stage));
		stageGroup->addChild(createBasicSpecializationTests(testCtx, stage.stage));
		stageGroup->addChild(createBuiltInOverrideTests    (testCtx, stage.stage));
		stageGroup->addChild(createExpressionTests         (testCtx, stage.stage));
		stageGroup->addChild(createCompositeTests          (testCtx, stage.stage));

		if (stage.stage == VK_SHADER_STAGE_COMPUTE_BIT)
			stageGroup->addChild(createWorkGroupSizeTests(testCtx));

		stage.parentGroup->addChild(stageGroup.release());
	}

	return allTests.release();
}